

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve_avx2.c
# Opt level: O0

void av1_convolve_x_sr_general_avx2
               (uint8_t *src,int src_stride,uint8_t *dst,int dst_stride,int w,int h,
               InterpFilterParams *filter_params_x,int subpel_x_qn,ConvolveParams *conv_params)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  __m256i data_00;
  __m256i data_01;
  __m256i data_02;
  __m256i data_03;
  __m256i data_04;
  __m256i data_05;
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined4 uVar40;
  undefined4 uVar41;
  undefined1 auVar47 [16];
  undefined8 uVar50;
  undefined8 uVar52;
  undefined1 auVar51 [16];
  long lVar42;
  int in_ECX;
  uint uVar43;
  long in_RDX;
  longlong extraout_RDX;
  longlong extraout_RDX_00;
  longlong extraout_RDX_01;
  longlong extraout_RDX_02;
  longlong extraout_RDX_03;
  longlong extraout_RDX_04;
  int in_ESI;
  uint8_t *puVar44;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  undefined8 uVar45;
  undefined8 uVar49;
  undefined1 auVar46 [16];
  undefined1 auVar48 [32];
  __m128i v;
  __m128i v_00;
  __m128i v_01;
  __m128i v_02;
  __m128i v_03;
  __m128i v_04;
  long in_stack_00000008;
  undefined4 in_stack_0000001c;
  __m256i res_16b_5;
  __m256i data_7;
  int j_3;
  __m128i *p_1_2;
  __m128i *p_0_2;
  __m128i res_1_4;
  __m128i res_0_4;
  __m256i res_8b_4;
  __m256i res_16b_4;
  __m256i data_6;
  uint8_t *src_ptr_3;
  int fo_horiz_3;
  __m128i res_1_3;
  __m128i res_0_3;
  __m256i res_8b_lo_1;
  __m256i res_16b_lo_1;
  __m256i res_32b_lo_1;
  __m256i res_lo_1;
  __m256i s_hihi_1;
  __m256i s_hilo_1;
  __m256i s_lohi_1;
  __m256i s_lolo_1;
  __m256i s_16hi_1;
  __m256i s_16lo_1;
  __m256i data_5;
  int j_2;
  __m128i res_1_2;
  __m128i res_0_2;
  __m256i res_8b_lo;
  __m256i res_16b_lo;
  __m256i res_32b_lo;
  __m256i res_lo;
  __m256i s_hihi;
  __m256i s_hilo;
  __m256i s_lohi;
  __m256i s_lolo;
  __m256i s_16hi;
  __m256i s_16lo;
  __m256i data_4;
  __m256i s [6];
  __m256i v_zero;
  uint8_t *src_ptr_2;
  int fo_horiz_2;
  __m128i res_2;
  __m256i res_8b_3;
  __m256i res_16b_3;
  __m256i data_3;
  int j_1;
  __m128i *p_1_1;
  __m128i *p_0_1;
  __m128i res_1_1;
  __m128i res_0_1;
  __m256i res_8b_2;
  __m256i res_16b_2;
  __m256i data_2;
  uint8_t *src_ptr_1;
  int fo_horiz_1;
  __m128i res;
  __m256i res_8b_1;
  __m256i res_16b_1;
  __m256i data_1;
  int j;
  __m128i *p_1;
  __m128i *p_0;
  __m128i res_1;
  __m128i res_0;
  __m256i res_8b;
  __m256i res_16b;
  __m256i data;
  uint8_t *src_ptr;
  int fo_horiz;
  __m256i filt [4];
  __m256i coeffs [6];
  int horiz_tap;
  int i;
  __m256i round_const;
  __m128i round_0_shift;
  __m256i round_0_const;
  __m128i round_shift;
  int bits;
  InterpFilterParams *in_stack_ffffffffffffe270;
  undefined8 local_1d80;
  undefined8 uStack_1d78;
  undefined8 uStack_1d70;
  undefined8 uStack_1d68;
  undefined8 local_1d60;
  __m256i *in_stack_ffffffffffffe2a8;
  undefined4 in_stack_ffffffffffffe2b0;
  int in_stack_ffffffffffffe2b4;
  undefined4 in_stack_ffffffffffffe2b8;
  int in_stack_ffffffffffffe2bc;
  InterpFilterParams *in_stack_ffffffffffffe2c0;
  undefined8 in_stack_ffffffffffffe2c8;
  longlong in_stack_ffffffffffffe2d0;
  undefined4 in_stack_ffffffffffffe2e8;
  undefined4 in_stack_ffffffffffffe2ec;
  int iVar53;
  __m256i *in_stack_ffffffffffffe2f0;
  undefined2 *in_stack_ffffffffffffe2f8;
  undefined8 in_stack_ffffffffffffe300;
  undefined8 in_stack_ffffffffffffe308;
  longlong in_stack_ffffffffffffe310;
  longlong local_1ce0;
  undefined8 uStack_1cd8;
  undefined8 uStack_1cd0;
  undefined8 uStack_1cc8;
  undefined1 local_1cc0 [16];
  undefined8 uStack_1cb0;
  undefined8 uStack_1ca8;
  __m256i *in_stack_ffffffffffffe368;
  __m256i *in_stack_ffffffffffffe370;
  undefined4 local_1c60;
  undefined8 uStack_1c30;
  undefined8 uStack_1c28;
  undefined8 local_1c20;
  undefined8 uStack_1c18;
  undefined8 uStack_1c10;
  undefined8 uStack_1c08;
  undefined8 local_1c00;
  undefined8 uStack_1bf8;
  undefined8 uStack_1bf0;
  undefined8 uStack_1be8;
  undefined8 local_1be0;
  undefined8 uStack_1bd8;
  undefined8 uStack_1bd0;
  undefined8 uStack_1bc8;
  undefined8 local_1b40;
  undefined8 uStack_1b38;
  undefined8 uStack_1b30;
  undefined8 uStack_1b28;
  undefined8 local_1b20;
  undefined8 uStack_1b18;
  undefined8 uStack_1b10;
  undefined8 uStack_1b08;
  int local_1ac4;
  undefined8 local_1aa0;
  undefined8 uStack_1a98;
  undefined8 uStack_1a90;
  undefined8 uStack_1a88;
  undefined8 local_1a80;
  undefined8 uStack_1a78;
  undefined8 uStack_1a70;
  undefined8 uStack_1a68;
  undefined8 local_1a60;
  undefined8 uStack_1a58;
  undefined8 uStack_1a50;
  undefined8 uStack_1a48;
  undefined8 local_1a40;
  undefined8 uStack_1a38;
  undefined8 uStack_1a30;
  undefined8 uStack_1a28;
  undefined8 local_19a0;
  undefined8 uStack_1998;
  undefined8 uStack_1990;
  undefined8 uStack_1988;
  undefined8 local_1980;
  undefined8 uStack_1978;
  undefined8 uStack_1970;
  undefined8 uStack_1968;
  undefined8 local_1840;
  undefined8 uStack_1838;
  undefined8 uStack_1830;
  undefined8 uStack_1828;
  undefined8 local_1820;
  undefined8 uStack_1818;
  undefined8 uStack_1810;
  undefined8 uStack_1808;
  int local_17d4;
  undefined8 local_17a0;
  undefined8 uStack_1798;
  undefined8 uStack_1790;
  undefined8 uStack_1788;
  undefined1 local_1780 [16];
  undefined8 uStack_1770;
  undefined8 uStack_1768;
  undefined8 local_1720;
  undefined8 uStack_1718;
  undefined8 uStack_1710;
  undefined8 uStack_1708;
  undefined8 local_1700;
  undefined8 uStack_16f8;
  undefined8 uStack_16f0;
  undefined8 uStack_16e8;
  int local_16b4;
  undefined8 local_1680;
  undefined8 uStack_1678;
  undefined8 uStack_1670;
  undefined8 uStack_1668;
  undefined1 local_1660 [16];
  undefined8 uStack_1650;
  undefined8 uStack_1648;
  uint8_t local_1600 [8];
  uint8_t auStack_15f8 [8];
  uint8_t auStack_15f0 [8];
  uint8_t auStack_15e8 [8];
  uint8_t local_15e0 [8];
  uint8_t auStack_15d8 [8];
  uint8_t auStack_15d0 [8];
  uint8_t auStack_15c8 [8];
  uint8_t local_15c0 [8];
  uint8_t auStack_15b8 [8];
  uint8_t auStack_15b0 [8];
  uint8_t auStack_15a8 [8];
  uint8_t local_15a0 [8];
  uint8_t auStack_1598 [8];
  uint8_t auStack_1590 [8];
  uint8_t auStack_1588 [224];
  int local_14a8;
  int local_14a4;
  undefined1 local_14a0 [16];
  undefined1 auStack_1490 [16];
  ulong local_1470;
  undefined8 uStack_1468;
  undefined8 local_1460;
  undefined8 uStack_1458;
  undefined8 uStack_1450;
  undefined8 uStack_1448;
  ulong local_1440;
  undefined8 uStack_1438;
  uint local_1428;
  int local_1424;
  int local_1420;
  int local_141c;
  long local_1418;
  int local_140c;
  long local_1408;
  undefined1 local_1400 [16];
  uint local_13e4;
  undefined1 local_13e0 [16];
  uint local_13c4;
  undefined1 local_13c0 [16];
  uint local_13b0;
  ushort local_13ac;
  ushort local_13aa;
  undefined1 (*local_13a8) [16];
  undefined8 *local_13a0;
  undefined8 *local_1398;
  undefined8 *local_1390;
  undefined1 (*local_1388) [16];
  undefined8 *local_1380;
  undefined1 (*local_1378) [16];
  undefined1 (*local_1370) [16];
  undefined8 *local_1368;
  undefined8 *local_1360;
  undefined1 (*local_1358) [16];
  undefined8 *local_1350;
  undefined8 *local_1348;
  undefined8 local_1340;
  undefined8 uStack_1338;
  undefined8 local_1330;
  undefined8 uStack_1328;
  undefined8 local_1320;
  undefined8 uStack_1318;
  undefined8 local_1310;
  undefined8 uStack_1308;
  undefined8 local_1300;
  undefined8 uStack_12f8;
  undefined8 local_12f0;
  undefined8 uStack_12e8;
  undefined8 local_12e0;
  undefined8 uStack_12d8;
  undefined8 local_12d0;
  undefined8 uStack_12c8;
  undefined8 local_12c0;
  undefined8 uStack_12b8;
  undefined8 local_12b0;
  undefined8 uStack_12a8;
  undefined8 local_12a0;
  undefined8 uStack_1298;
  undefined8 uStack_1290;
  undefined8 uStack_1288;
  undefined8 local_1280;
  undefined8 uStack_1278;
  undefined8 uStack_1270;
  undefined8 uStack_1268;
  undefined8 local_1260;
  undefined8 uStack_1258;
  undefined8 uStack_1250;
  undefined8 uStack_1248;
  undefined8 local_1240;
  undefined8 uStack_1238;
  undefined8 uStack_1230;
  undefined8 uStack_1228;
  undefined8 local_1220;
  undefined8 uStack_1218;
  undefined8 uStack_1210;
  undefined8 uStack_1208;
  undefined8 local_1200;
  undefined8 uStack_11f8;
  undefined8 uStack_11f0;
  undefined8 uStack_11e8;
  undefined8 local_11e0;
  undefined8 uStack_11d8;
  undefined8 uStack_11d0;
  undefined8 uStack_11c8;
  undefined8 local_11c0;
  undefined8 uStack_11b8;
  undefined8 uStack_11b0;
  undefined8 uStack_11a8;
  ulong local_1190;
  undefined8 uStack_1188;
  undefined1 local_1180 [32];
  ulong local_1150;
  undefined8 uStack_1148;
  undefined1 local_1140 [32];
  ulong local_1110;
  undefined8 uStack_1108;
  undefined1 local_1100 [32];
  ulong local_10d0;
  undefined8 uStack_10c8;
  undefined1 local_10c0 [32];
  ulong local_1090;
  undefined8 uStack_1088;
  undefined1 local_1080 [32];
  ulong local_1050;
  undefined8 uStack_1048;
  undefined1 local_1040 [32];
  ulong local_1010;
  undefined8 uStack_1008;
  undefined1 local_1000 [32];
  ulong local_fd0;
  undefined8 uStack_fc8;
  undefined1 local_fc0 [32];
  ulong local_f90;
  undefined8 uStack_f88;
  undefined1 local_f80 [32];
  ulong local_f50;
  undefined8 uStack_f48;
  undefined1 local_f40 [32];
  ulong local_f10;
  undefined8 uStack_f08;
  undefined1 local_f00 [32];
  ulong local_ed0;
  undefined8 uStack_ec8;
  undefined1 local_ec0 [32];
  undefined1 local_ea0 [16];
  undefined8 uStack_e90;
  undefined8 uStack_e88;
  undefined8 local_e80;
  undefined8 uStack_e78;
  undefined8 uStack_e70;
  undefined8 uStack_e68;
  undefined8 local_e60;
  undefined8 uStack_e58;
  undefined8 uStack_e50;
  undefined8 uStack_e48;
  undefined1 local_e40 [16];
  undefined8 uStack_e30;
  undefined8 uStack_e28;
  undefined1 local_e20 [16];
  undefined1 auStack_e10 [16];
  undefined8 local_e00;
  undefined8 uStack_df8;
  undefined8 uStack_df0;
  undefined8 uStack_de8;
  undefined8 local_de0;
  undefined8 uStack_dd8;
  undefined8 uStack_dd0;
  undefined8 uStack_dc8;
  undefined8 local_dc0;
  undefined8 uStack_db8;
  undefined8 uStack_db0;
  undefined8 uStack_da8;
  undefined1 local_da0 [16];
  undefined8 uStack_d90;
  undefined8 uStack_d88;
  undefined8 local_d80;
  undefined8 uStack_d78;
  undefined8 uStack_d70;
  undefined8 uStack_d68;
  undefined8 local_d60;
  undefined8 uStack_d58;
  undefined8 uStack_d50;
  undefined8 uStack_d48;
  undefined1 local_d40 [16];
  undefined1 auStack_d30 [16];
  undefined1 local_d20 [16];
  undefined1 auStack_d10 [16];
  undefined8 local_d00;
  undefined8 uStack_cf8;
  undefined8 uStack_cf0;
  undefined8 uStack_ce8;
  undefined8 local_ce0;
  undefined8 uStack_cd8;
  undefined8 uStack_cd0;
  undefined8 uStack_cc8;
  undefined8 local_cc0;
  undefined8 uStack_cb8;
  undefined8 uStack_cb0;
  undefined8 uStack_ca8;
  undefined1 local_ca0 [16];
  undefined8 uStack_c90;
  undefined8 uStack_c88;
  undefined8 local_c80;
  undefined8 uStack_c78;
  undefined8 uStack_c70;
  undefined8 uStack_c68;
  undefined8 local_c60;
  undefined8 uStack_c58;
  undefined8 uStack_c50;
  undefined8 uStack_c48;
  undefined1 local_c40 [16];
  undefined1 auStack_c30 [16];
  undefined1 local_c20 [16];
  undefined1 auStack_c10 [16];
  undefined8 local_c00;
  undefined8 uStack_bf8;
  undefined8 uStack_bf0;
  undefined8 uStack_be8;
  undefined8 local_be0;
  undefined8 uStack_bd8;
  undefined8 uStack_bd0;
  undefined8 uStack_bc8;
  undefined8 local_bc0;
  undefined8 uStack_bb8;
  undefined8 uStack_bb0;
  undefined8 uStack_ba8;
  undefined8 local_ba0;
  undefined8 uStack_b98;
  undefined8 uStack_b90;
  undefined8 uStack_b88;
  undefined8 local_b80;
  undefined8 uStack_b78;
  undefined8 uStack_b70;
  undefined8 uStack_b68;
  undefined8 local_b60;
  undefined8 uStack_b58;
  undefined8 uStack_b50;
  undefined8 uStack_b48;
  undefined8 local_b40;
  undefined8 uStack_b38;
  undefined8 uStack_b30;
  undefined8 uStack_b28;
  undefined8 local_b20;
  undefined8 uStack_b18;
  undefined8 uStack_b10;
  undefined8 uStack_b08;
  undefined8 local_b00;
  undefined8 uStack_af8;
  undefined8 uStack_af0;
  undefined8 uStack_ae8;
  undefined8 local_ae0;
  undefined8 uStack_ad8;
  undefined8 uStack_ad0;
  undefined8 uStack_ac8;
  undefined8 local_ac0;
  undefined8 uStack_ab8;
  undefined8 uStack_ab0;
  undefined8 uStack_aa8;
  undefined8 local_aa0;
  undefined8 uStack_a98;
  undefined8 uStack_a90;
  undefined8 uStack_a88;
  undefined8 local_a80;
  undefined8 uStack_a78;
  undefined8 uStack_a70;
  undefined8 uStack_a68;
  undefined8 local_a60;
  undefined8 uStack_a58;
  undefined8 uStack_a50;
  undefined8 uStack_a48;
  undefined8 local_a40;
  undefined8 uStack_a38;
  undefined8 uStack_a30;
  undefined8 uStack_a28;
  undefined8 local_a20;
  undefined8 uStack_a18;
  undefined8 uStack_a10;
  undefined8 uStack_a08;
  undefined8 local_a00;
  undefined8 uStack_9f8;
  undefined8 uStack_9f0;
  undefined8 uStack_9e8;
  undefined8 local_9e0;
  undefined8 uStack_9d8;
  undefined8 uStack_9d0;
  undefined8 uStack_9c8;
  undefined8 local_9c0;
  undefined8 uStack_9b8;
  undefined8 uStack_9b0;
  undefined8 uStack_9a8;
  undefined8 local_9a0;
  undefined8 uStack_998;
  undefined8 uStack_990;
  undefined8 uStack_988;
  longlong local_980;
  undefined8 uStack_978;
  undefined8 uStack_970;
  undefined8 uStack_968;
  undefined8 local_960;
  undefined8 uStack_958;
  undefined8 uStack_950;
  undefined8 uStack_948;
  undefined8 local_940;
  undefined8 uStack_938;
  undefined8 uStack_930;
  undefined8 uStack_928;
  undefined8 local_920;
  undefined8 uStack_918;
  undefined8 uStack_910;
  undefined8 uStack_908;
  undefined8 local_900;
  undefined8 uStack_8f8;
  undefined8 uStack_8f0;
  undefined8 uStack_8e8;
  undefined8 local_8e0;
  undefined8 uStack_8d8;
  undefined8 *local_8c8;
  undefined8 local_8c0;
  undefined8 uStack_8b8;
  undefined8 *local_8a8;
  undefined8 local_8a0;
  undefined8 uStack_898;
  undefined8 *local_888;
  undefined8 local_880;
  undefined8 uStack_878;
  undefined8 *local_868;
  longlong local_860;
  undefined8 uStack_858;
  longlong *local_848;
  undefined8 local_840;
  undefined8 uStack_838;
  undefined8 *local_828;
  undefined8 local_820;
  undefined8 uStack_818;
  undefined8 *local_808;
  undefined8 local_800;
  undefined8 uStack_7f8;
  undefined8 *local_7e8;
  undefined8 local_7e0;
  undefined8 uStack_7d8;
  undefined8 *local_7c8;
  undefined8 local_7c0;
  undefined8 uStack_7b8;
  undefined8 local_7b0;
  undefined8 uStack_7a8;
  longlong local_7a0;
  undefined8 uStack_798;
  longlong local_790;
  undefined8 uStack_788;
  undefined8 local_760;
  undefined8 uStack_758;
  undefined8 local_750;
  undefined8 uStack_748;
  undefined8 local_740;
  undefined8 uStack_738;
  undefined8 local_730;
  undefined8 uStack_728;
  undefined8 local_720;
  undefined8 uStack_718;
  undefined8 local_710;
  undefined8 uStack_708;
  undefined8 local_700;
  undefined8 uStack_6f8;
  undefined8 local_6f0;
  undefined8 uStack_6e8;
  undefined8 local_6e0;
  undefined8 uStack_6d8;
  undefined8 local_6d0;
  undefined8 uStack_6c8;
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  undefined8 local_6b0;
  undefined8 uStack_6a8;
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 local_690;
  undefined8 uStack_688;
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 local_670;
  undefined8 uStack_668;
  undefined8 local_660;
  undefined8 uStack_658;
  undefined8 local_650;
  undefined8 uStack_648;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 uStack_630;
  undefined8 uStack_628;
  uint local_608;
  uint local_604;
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined8 uStack_5f0;
  undefined8 uStack_5e8;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 uStack_5d0;
  undefined8 uStack_5c8;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 uStack_5b0;
  undefined8 uStack_5a8;
  undefined8 local_5a0;
  undefined8 uStack_598;
  undefined8 uStack_590;
  undefined8 uStack_588;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 uStack_570;
  undefined8 uStack_568;
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 uStack_550;
  undefined8 uStack_548;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 uStack_530;
  undefined8 uStack_528;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 uStack_510;
  undefined8 uStack_508;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 uStack_4d0;
  undefined8 uStack_4c8;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 uStack_490;
  undefined8 uStack_488;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 uStack_470;
  undefined8 uStack_468;
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 uStack_450;
  undefined8 uStack_448;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 uStack_430;
  undefined8 uStack_428;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 uStack_410;
  undefined8 uStack_408;
  ulong local_3f0;
  undefined8 uStack_3e8;
  undefined1 local_3e0 [32];
  ulong local_3b0;
  undefined8 uStack_3a8;
  undefined1 local_3a0 [32];
  ulong local_370;
  undefined8 uStack_368;
  undefined1 local_360 [32];
  ulong local_330;
  undefined8 uStack_328;
  undefined1 local_320 [32];
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 uStack_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined1 local_180 [16];
  undefined1 auStack_170 [16];
  ushort local_160;
  ushort local_15e;
  ushort local_15c;
  ushort local_15a;
  ushort local_158;
  ushort local_156;
  ushort local_154;
  ushort local_152;
  ushort local_150;
  ushort local_14e;
  ushort local_14c;
  ushort local_14a;
  ushort local_148;
  ushort local_146;
  ushort local_144;
  ushort local_142;
  undefined1 local_140 [32];
  ushort local_120;
  ushort local_11e;
  ushort local_11c;
  ushort local_11a;
  ushort local_118;
  ushort local_116;
  ushort local_114;
  ushort local_112;
  ushort local_110;
  ushort local_10e;
  ushort local_10c;
  ushort local_10a;
  ushort local_108;
  ushort local_106;
  ushort local_104;
  ushort local_102;
  undefined1 local_100 [16];
  undefined1 auStack_f0 [16];
  uint local_e0;
  uint local_dc;
  uint local_d8;
  uint local_d4;
  uint local_d0;
  uint local_cc;
  uint local_c8;
  uint local_c4;
  undefined1 local_c0 [16];
  undefined1 auStack_b0 [16];
  uint local_98;
  uint local_94;
  uint local_90;
  uint local_8c;
  uint local_88;
  uint local_84;
  uint local_80;
  uint local_7c;
  undefined1 (*local_78) [32];
  undefined1 (*local_70) [32];
  undefined1 (*local_68) [32];
  uint8_t *local_60;
  uint8_t *local_58;
  uint8_t *local_50;
  uint8_t *local_48;
  uint8_t *local_40;
  uint8_t *local_38;
  
  local_1428 = 7 - *(int *)(CONCAT44(in_stack_0000001c,subpel_x_qn) + 0x14);
  local_13c0._4_4_ = 0;
  local_13c0._0_4_ = local_1428;
  local_1440 = local_13c0._0_8_;
  uStack_1438 = 0;
  uVar43 = (uint)(1 << (*(char *)(CONCAT44(in_stack_0000001c,subpel_x_qn) + 0x14) - 1U & 0x1f)) >> 1
  ;
  local_13aa = (ushort)uVar43;
  auVar46 = vpinsrw_avx(ZEXT216(local_13aa),uVar43 & 0xffff,1);
  auVar46 = vpinsrw_avx(auVar46,uVar43 & 0xffff,2);
  auVar46 = vpinsrw_avx(auVar46,uVar43 & 0xffff,3);
  auVar46 = vpinsrw_avx(auVar46,uVar43 & 0xffff,4);
  auVar46 = vpinsrw_avx(auVar46,uVar43 & 0xffff,5);
  auVar46 = vpinsrw_avx(auVar46,uVar43 & 0xffff,6);
  local_180 = vpinsrw_avx(auVar46,uVar43 & 0xffff,7);
  auVar46 = vpinsrw_avx(ZEXT216(local_13aa),uVar43 & 0xffff,1);
  auVar46 = vpinsrw_avx(auVar46,uVar43 & 0xffff,2);
  auVar46 = vpinsrw_avx(auVar46,uVar43 & 0xffff,3);
  auVar46 = vpinsrw_avx(auVar46,uVar43 & 0xffff,4);
  auVar46 = vpinsrw_avx(auVar46,uVar43 & 0xffff,5);
  auVar46 = vpinsrw_avx(auVar46,uVar43 & 0xffff,6);
  auStack_170 = vpinsrw_avx(auVar46,uVar43 & 0xffff,7);
  local_1460 = local_180._0_8_;
  uStack_1458 = local_180._8_8_;
  uStack_1450 = auStack_170._0_8_;
  uStack_1448 = auStack_170._8_8_;
  local_13c4 = *(int *)(CONCAT44(in_stack_0000001c,subpel_x_qn) + 0x14) - 1;
  local_13e0._4_4_ = 0;
  local_13e0._0_4_ = local_13c4;
  local_1470 = local_13e0._0_8_;
  uStack_1468 = 0;
  uVar43 = (uint)(1 << ((byte)local_1428 & 0x1f)) >> 1;
  local_13ac = (ushort)uVar43;
  auVar46 = vpinsrw_avx(ZEXT216(local_13ac),uVar43 & 0xffff,1);
  auVar46 = vpinsrw_avx(auVar46,uVar43 & 0xffff,2);
  auVar46 = vpinsrw_avx(auVar46,uVar43 & 0xffff,3);
  auVar46 = vpinsrw_avx(auVar46,uVar43 & 0xffff,4);
  auVar46 = vpinsrw_avx(auVar46,uVar43 & 0xffff,5);
  auVar46 = vpinsrw_avx(auVar46,uVar43 & 0xffff,6);
  auVar46 = vpinsrw_avx(auVar46,uVar43 & 0xffff,7);
  auVar51 = vpinsrw_avx(ZEXT216(local_13ac),uVar43 & 0xffff,1);
  auVar51 = vpinsrw_avx(auVar51,uVar43 & 0xffff,2);
  auVar51 = vpinsrw_avx(auVar51,uVar43 & 0xffff,3);
  auVar51 = vpinsrw_avx(auVar51,uVar43 & 0xffff,4);
  auVar51 = vpinsrw_avx(auVar51,uVar43 & 0xffff,5);
  auVar51 = vpinsrw_avx(auVar51,uVar43 & 0xffff,6);
  auVar51 = vpinsrw_avx(auVar51,uVar43 & 0xffff,7);
  local_140._0_16_ = ZEXT116(0) * auVar46 + ZEXT116(1) * auVar51;
  local_140._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar46;
  local_1424 = in_R9D;
  local_1420 = in_R8D;
  local_141c = in_ECX;
  local_1418 = in_RDX;
  local_140c = in_ESI;
  local_1408 = in_RDI;
  local_13e0 = ZEXT416(local_13c4);
  local_13c0 = ZEXT416(local_1428);
  local_13b0 = local_1428;
  local_160 = local_13aa;
  local_15e = local_13aa;
  local_15c = local_13aa;
  local_15a = local_13aa;
  local_158 = local_13aa;
  local_156 = local_13aa;
  local_154 = local_13aa;
  local_152 = local_13aa;
  local_150 = local_13aa;
  local_14e = local_13aa;
  local_14c = local_13aa;
  local_14a = local_13aa;
  local_148 = local_13aa;
  local_146 = local_13aa;
  local_144 = local_13aa;
  local_142 = local_13aa;
  local_120 = local_13ac;
  local_11e = local_13ac;
  local_11c = local_13ac;
  local_11a = local_13ac;
  local_118 = local_13ac;
  local_116 = local_13ac;
  local_114 = local_13ac;
  local_112 = local_13ac;
  local_110 = local_13ac;
  local_10e = local_13ac;
  local_10c = local_13ac;
  local_10a = local_13ac;
  local_108 = local_13ac;
  local_106 = local_13ac;
  local_104 = local_13ac;
  local_102 = local_13ac;
  local_14a0 = local_140._0_16_;
  auStack_1490 = local_140._16_16_;
  local_14a8 = get_filter_tap(in_stack_ffffffffffffe270,CONCAT22(local_13ac,local_13aa));
  local_38 = "";
  local_1600[0] = '\0';
  local_1600[1] = '\x01';
  local_1600[2] = '\x01';
  local_1600[3] = '\x02';
  local_1600[4] = '\x02';
  local_1600[5] = '\x03';
  local_1600[6] = '\x03';
  local_1600[7] = '\x04';
  auStack_15f8[0] = '\x04';
  auStack_15f8[1] = '\x05';
  auStack_15f8[2] = '\x05';
  auStack_15f8[3] = '\x06';
  auStack_15f8[4] = '\x06';
  auStack_15f8[5] = '\a';
  auStack_15f8[6] = '\a';
  auStack_15f8[7] = '\b';
  auStack_15f0[0] = '\0';
  auStack_15f0[1] = '\x01';
  auStack_15f0[2] = '\x01';
  auStack_15f0[3] = '\x02';
  auStack_15f0[4] = '\x02';
  auStack_15f0[5] = '\x03';
  auStack_15f0[6] = '\x03';
  auStack_15f0[7] = '\x04';
  auStack_15e8[0] = '\x04';
  auStack_15e8[1] = '\x05';
  auStack_15e8[2] = '\x05';
  auStack_15e8[3] = '\x06';
  auStack_15e8[4] = '\x06';
  auStack_15e8[5] = '\a';
  auStack_15e8[6] = '\a';
  auStack_15e8[7] = '\b';
  local_40 = 
  "\x02\x03\x03\x04\x04\x05\x05\x06\x06\a\a\b\b\t\t\n\x02\x03\x03\x04\x04\x05\x05\x06\x06\a\a\b\b\t\t\n\x04\x05\x05\x06\x06\a\a\b\b\t\t\n\n\v\v\f\x04\x05\x05\x06\x06\a\a\b\b\t\t\n\n\v\v\f\x06\a\a\b\b\t\t\n\n\v\v\f\f\r\r\x0e\x06\a\a\b\b\t\t\n\n\v\v\f\f\r\r\x0e"
  ;
  local_15e0[0] = '\x02';
  local_15e0[1] = '\x03';
  local_15e0[2] = '\x03';
  local_15e0[3] = '\x04';
  local_15e0[4] = '\x04';
  local_15e0[5] = '\x05';
  local_15e0[6] = '\x05';
  local_15e0[7] = '\x06';
  auStack_15d8[0] = '\x06';
  auStack_15d8[1] = '\a';
  auStack_15d8[2] = '\a';
  auStack_15d8[3] = '\b';
  auStack_15d8[4] = '\b';
  auStack_15d8[5] = '\t';
  auStack_15d8[6] = '\t';
  auStack_15d8[7] = '\n';
  auStack_15d0[0] = '\x02';
  auStack_15d0[1] = '\x03';
  auStack_15d0[2] = '\x03';
  auStack_15d0[3] = '\x04';
  auStack_15d0[4] = '\x04';
  auStack_15d0[5] = '\x05';
  auStack_15d0[6] = '\x05';
  auStack_15d0[7] = '\x06';
  auStack_15c8[0] = '\x06';
  auStack_15c8[1] = '\a';
  auStack_15c8[2] = '\a';
  auStack_15c8[3] = '\b';
  auStack_15c8[4] = '\b';
  auStack_15c8[5] = '\t';
  auStack_15c8[6] = '\t';
  auStack_15c8[7] = '\n';
  if (local_14a8 == 6) {
    prepare_coeffs_6t_lowbd
              (in_stack_ffffffffffffe2c0,in_stack_ffffffffffffe2bc,
               (__m256i *)CONCAT44(in_stack_ffffffffffffe2b4,in_stack_ffffffffffffe2b0));
    uStack_1cd0 = in_stack_ffffffffffffe300;
    uStack_1cc8 = in_stack_ffffffffffffe308;
    local_1ce0 = in_stack_ffffffffffffe310;
  }
  else if (local_14a8 == 0xc) {
    prepare_coeffs_12taps
              ((InterpFilterParams *)CONCAT44(in_stack_ffffffffffffe2bc,in_stack_ffffffffffffe2b8),
               in_stack_ffffffffffffe2b4,in_stack_ffffffffffffe2a8);
    uStack_1cd0 = in_stack_ffffffffffffe300;
    uStack_1cc8 = in_stack_ffffffffffffe308;
    local_1ce0 = in_stack_ffffffffffffe310;
  }
  else {
    prepare_coeffs_lowbd
              (in_stack_ffffffffffffe2c0,in_stack_ffffffffffffe2bc,
               (__m256i *)CONCAT44(in_stack_ffffffffffffe2b4,in_stack_ffffffffffffe2b0));
    uStack_1cd0 = in_stack_ffffffffffffe300;
    uStack_1cc8 = in_stack_ffffffffffffe308;
    local_1ce0 = in_stack_ffffffffffffe310;
  }
  auVar46._8_8_ = uStack_e28;
  auVar46._0_8_ = in_stack_ffffffffffffe2d0;
  if (local_14a8 == 4) {
    lVar42 = local_1408 + -1;
    if (local_1420 < 9) {
      for (local_14a4 = 0; local_14a4 < local_1424; local_14a4 = local_14a4 + 2) {
        local_1348 = (undefined8 *)(lVar42 + local_14a4 * local_140c);
        uVar45 = *local_1348;
        uVar49 = local_1348[1];
        local_1350 = (undefined8 *)(lVar42 + (local_14a4 * local_140c + local_140c));
        uVar50 = *local_1350;
        uVar52 = local_1350[1];
        puVar44 = local_1600;
        data_00[0]._4_4_ = in_stack_ffffffffffffe2bc;
        data_00[0]._0_4_ = in_stack_ffffffffffffe2b8;
        data_00[1] = (longlong)in_stack_ffffffffffffe2c0;
        data_00[2] = in_stack_ffffffffffffe2c8;
        data_00[3] = in_stack_ffffffffffffe2d0;
        local_12c0 = uVar50;
        uStack_12b8 = uVar52;
        local_12b0 = uVar45;
        uStack_12a8 = uVar49;
        convolve_lowbd_x_4tap
                  (data_00,(__m256i *)CONCAT44(in_stack_ffffffffffffe2b4,in_stack_ffffffffffffe2b0),
                   in_stack_ffffffffffffe2a8);
        local_1660._8_8_ = uVar49;
        local_1660._0_8_ = uVar45;
        local_be0 = local_1460;
        uStack_bd8 = uStack_1458;
        uStack_bd0 = uStack_1450;
        uStack_bc8 = uStack_1448;
        auVar31._16_8_ = uVar50;
        auVar31._0_16_ = local_1660;
        auVar31._24_8_ = uVar52;
        auVar30._8_8_ = uStack_1458;
        auVar30._0_8_ = local_1460;
        auVar30._16_8_ = uStack_1450;
        auVar30._24_8_ = uStack_1448;
        local_ec0 = vpaddw_avx2(auVar31,auVar30);
        local_ed0 = local_1470;
        uStack_ec8 = uStack_1468;
        auVar17._8_8_ = uStack_1468;
        auVar17._0_8_ = local_1470;
        auVar48 = vpsraw_avx2(local_ec0,auVar17);
        local_1660._0_8_ = auVar48._0_8_;
        local_1660._8_8_ = auVar48._8_8_;
        uStack_1650 = auVar48._16_8_;
        uStack_1648 = auVar48._24_8_;
        local_c00 = local_1660._0_8_;
        uStack_bf8 = local_1660._8_8_;
        uStack_bf0 = uStack_1650;
        uStack_be8 = uStack_1648;
        auVar29._16_8_ = auStack_1490._0_8_;
        auVar29._0_16_ = local_14a0;
        auVar29._24_8_ = auStack_1490._8_8_;
        local_f00 = vpaddw_avx2(auVar48,auVar29);
        local_f10 = local_1440;
        uStack_f08 = uStack_1438;
        auVar16._8_8_ = uStack_1438;
        auVar16._0_8_ = local_1440;
        auVar48 = vpsraw_avx2(local_f00,auVar16);
        local_1660._0_8_ = auVar48._0_8_;
        local_1660._8_8_ = auVar48._8_8_;
        uStack_1650 = auVar48._16_8_;
        uStack_1648 = auVar48._24_8_;
        local_9c0 = local_1660._0_8_;
        uStack_9b8 = local_1660._8_8_;
        uStack_9b0 = uStack_1650;
        uStack_9a8 = uStack_1648;
        local_9e0 = local_1660._0_8_;
        uStack_9d8 = local_1660._8_8_;
        uStack_9d0 = uStack_1650;
        uStack_9c8 = uStack_1648;
        auVar48 = vpackuswb_avx2(auVar48,auVar48);
        local_1680 = auVar48._0_8_;
        uStack_1678 = auVar48._8_8_;
        uStack_1670 = auVar48._16_8_;
        uStack_1668 = auVar48._24_8_;
        local_900 = local_1680;
        uStack_8f8 = uStack_1678;
        uStack_8f0 = uStack_1670;
        uStack_8e8 = uStack_1668;
        local_bc0 = uVar45;
        uStack_bb8 = uVar49;
        uStack_bb0 = uVar50;
        uStack_ba8 = uVar52;
        local_c20 = local_14a0;
        auStack_c10 = auStack_1490;
        if (local_1420 < 5) {
          if (local_1420 < 3) {
            local_650 = local_1680;
            uStack_648 = uStack_1678;
            local_660 = local_1680;
            uStack_658 = uStack_1678;
            *(short *)(local_1418 + local_14a4 * local_141c) = auVar48._0_2_;
            local_670 = uStack_1670;
            uStack_668 = uStack_1668;
            local_680 = uStack_1670;
            uStack_678 = uStack_1668;
            *(short *)(local_1418 + (local_14a4 * local_141c + local_141c)) = auVar48._16_2_;
          }
          else {
            v[1] = extraout_RDX;
            v[0] = (longlong)puVar44;
            xx_storel_32((void *)(local_1418 + local_14a4 * local_141c),v);
            v_00[1] = extraout_RDX_00;
            v_00[0] = (longlong)puVar44;
            xx_storel_32((void *)(local_1418 + (local_14a4 * local_141c + local_141c)),v_00);
            local_c20 = local_c20;
            auStack_c10 = auStack_c10;
          }
        }
        else {
          local_7c8 = (undefined8 *)(local_1418 + local_14a4 * local_141c);
          local_7e0 = local_1680;
          uStack_7d8 = uStack_1678;
          *local_7c8 = local_1680;
          local_7e8 = (undefined8 *)(local_1418 + (local_14a4 * local_141c + local_141c));
          local_800 = uStack_1670;
          uStack_7f8 = uStack_1668;
          *local_7e8 = uStack_1670;
        }
      }
    }
    else {
      for (local_14a4 = 0; local_14a4 < local_1424; local_14a4 = local_14a4 + 1) {
        for (local_16b4 = 0; local_16b4 < local_1420; local_16b4 = local_16b4 + 0x10) {
          local_68 = (undefined1 (*) [32])(lVar42 + (local_14a4 * local_140c + local_16b4));
          local_1358 = (undefined1 (*) [16])(lVar42 + (local_16b4 + 8 + local_14a4 * local_140c));
          auVar46 = ZEXT116(0) * *local_1358 + ZEXT116(1) * SUB3216(*local_68,0);
          auVar51 = ZEXT116(0) * SUB3216(*local_68,0x10) + ZEXT116(1) * *local_1358;
          data_01[0]._4_4_ = in_stack_ffffffffffffe2bc;
          data_01[0]._0_4_ = in_stack_ffffffffffffe2b8;
          data_01[1] = (longlong)in_stack_ffffffffffffe2c0;
          data_01[2] = in_stack_ffffffffffffe2c8;
          data_01[3] = in_stack_ffffffffffffe2d0;
          convolve_lowbd_x_4tap
                    (data_01,(__m256i *)
                             CONCAT44(in_stack_ffffffffffffe2b4,in_stack_ffffffffffffe2b0),
                     in_stack_ffffffffffffe2a8);
          local_c60 = local_1460;
          uStack_c58 = uStack_1458;
          uStack_c50 = uStack_1450;
          uStack_c48 = uStack_1448;
          auVar28._16_8_ = auVar51._0_8_;
          auVar28._0_16_ = auVar46;
          auVar28._24_8_ = auVar51._8_8_;
          auVar27._8_8_ = uStack_1458;
          auVar27._0_8_ = local_1460;
          auVar27._16_8_ = uStack_1450;
          auVar27._24_8_ = uStack_1448;
          local_f40 = vpaddw_avx2(auVar28,auVar27);
          local_f50 = local_1470;
          uStack_f48 = uStack_1468;
          auVar15._8_8_ = uStack_1468;
          auVar15._0_8_ = local_1470;
          auVar48 = vpsraw_avx2(local_f40,auVar15);
          local_1700 = auVar48._0_8_;
          local_c80 = local_1700;
          uStack_16f8 = auVar48._8_8_;
          uStack_c78 = uStack_16f8;
          uStack_16f0 = auVar48._16_8_;
          uStack_c70 = uStack_16f0;
          uStack_16e8 = auVar48._24_8_;
          uStack_c68 = uStack_16e8;
          uStack_c90 = auStack_1490._0_8_;
          uStack_c88 = auStack_1490._8_8_;
          auVar26._16_8_ = auStack_1490._0_8_;
          auVar26._0_16_ = local_14a0;
          auVar26._24_8_ = auStack_1490._8_8_;
          local_f80 = vpaddw_avx2(auVar48,auVar26);
          local_f90 = local_1440;
          uStack_f88 = uStack_1438;
          auVar14._8_8_ = uStack_1438;
          auVar14._0_8_ = local_1440;
          auVar48 = vpsraw_avx2(local_f80,auVar14);
          local_1700 = auVar48._0_8_;
          local_a20 = local_1700;
          uStack_16f8 = auVar48._8_8_;
          uStack_a18 = uStack_16f8;
          uStack_16f0 = auVar48._16_8_;
          uStack_a10 = uStack_16f0;
          uStack_16e8 = auVar48._24_8_;
          uStack_a08 = uStack_16e8;
          auVar48 = vpackuswb_avx2(auVar48,auVar48);
          auVar48 = vpermq_avx2(auVar48,0xd8);
          local_1720 = auVar48._0_8_;
          local_920 = local_1720;
          uStack_1718 = auVar48._8_8_;
          uStack_918 = uStack_1718;
          uStack_1710 = auVar48._16_8_;
          uStack_910 = uStack_1710;
          uStack_1708 = auVar48._24_8_;
          uStack_908 = uStack_1708;
          local_888 = (undefined8 *)(local_1418 + (local_14a4 * local_141c + local_16b4));
          local_8a0 = local_1720;
          uStack_898 = uStack_1718;
          *local_888 = local_1720;
          local_888[1] = uStack_1718;
          local_a00 = local_a20;
          uStack_9f8 = uStack_a18;
          uStack_9f0 = uStack_a10;
          uStack_9e8 = uStack_a08;
          local_c40 = auVar46;
          auStack_c30 = auVar51;
          local_ca0 = local_14a0;
        }
      }
    }
  }
  else if (local_14a8 == 6) {
    lVar42 = local_1408 + -2;
    local_48 = 
    "\x04\x05\x05\x06\x06\a\a\b\b\t\t\n\n\v\v\f\x04\x05\x05\x06\x06\a\a\b\b\t\t\n\n\v\v\f\x06\a\a\b\b\t\t\n\n\v\v\f\f\r\r\x0e\x06\a\a\b\b\t\t\n\n\v\v\f\f\r\r\x0e"
    ;
    local_15c0[0] = '\x04';
    local_15c0[1] = '\x05';
    local_15c0[2] = '\x05';
    local_15c0[3] = '\x06';
    local_15c0[4] = '\x06';
    local_15c0[5] = '\a';
    local_15c0[6] = '\a';
    local_15c0[7] = '\b';
    auStack_15b8[0] = '\b';
    auStack_15b8[1] = '\t';
    auStack_15b8[2] = '\t';
    auStack_15b8[3] = '\n';
    auStack_15b8[4] = '\n';
    auStack_15b8[5] = '\v';
    auStack_15b8[6] = '\v';
    auStack_15b8[7] = '\f';
    auStack_15b0[0] = '\x04';
    auStack_15b0[1] = '\x05';
    auStack_15b0[2] = '\x05';
    auStack_15b0[3] = '\x06';
    auStack_15b0[4] = '\x06';
    auStack_15b0[5] = '\a';
    auStack_15b0[6] = '\a';
    auStack_15b0[7] = '\b';
    auStack_15a8[0] = '\b';
    auStack_15a8[1] = '\t';
    auStack_15a8[2] = '\t';
    auStack_15a8[3] = '\n';
    auStack_15a8[4] = '\n';
    auStack_15a8[5] = '\v';
    auStack_15a8[6] = '\v';
    auStack_15a8[7] = '\f';
    local_50 = "\x06\a\a\b\b\t\t\n\n\v\v\f\f\r\r\x0e\x06\a\a\b\b\t\t\n\n\v\v\f\f\r\r\x0e";
    local_15a0[0] = '\x06';
    local_15a0[1] = '\a';
    local_15a0[2] = '\a';
    local_15a0[3] = '\b';
    local_15a0[4] = '\b';
    local_15a0[5] = '\t';
    local_15a0[6] = '\t';
    local_15a0[7] = '\n';
    auStack_1598[0] = '\n';
    auStack_1598[1] = '\v';
    auStack_1598[2] = '\v';
    auStack_1598[3] = '\f';
    auStack_1598[4] = '\f';
    auStack_1598[5] = '\r';
    auStack_1598[6] = '\r';
    auStack_1598[7] = '\x0e';
    auStack_1590[0] = '\x06';
    auStack_1590[1] = '\a';
    auStack_1590[2] = '\a';
    auStack_1590[3] = '\b';
    auStack_1590[4] = '\b';
    auStack_1590[5] = '\t';
    auStack_1590[6] = '\t';
    auStack_1590[7] = '\n';
    auStack_1588[0] = '\n';
    auStack_1588[1] = '\v';
    auStack_1588[2] = '\v';
    auStack_1588[3] = '\f';
    auStack_1588[4] = '\f';
    auStack_1588[5] = '\r';
    auStack_1588[6] = '\r';
    auStack_1588[7] = '\x0e';
    if (local_1420 < 9) {
      for (local_14a4 = 0; local_14a4 < local_1424; local_14a4 = local_14a4 + 2) {
        local_1360 = (undefined8 *)(lVar42 + local_14a4 * local_140c);
        uVar45 = *local_1360;
        uVar49 = local_1360[1];
        local_1368 = (undefined8 *)(lVar42 + (local_14a4 * local_140c + local_140c));
        uVar50 = *local_1368;
        uVar52 = local_1368[1];
        puVar44 = local_1600;
        data_02[1] = uStack_1cd0;
        data_02[0] = (longlong)in_stack_ffffffffffffe2f8;
        data_02[2] = uStack_1cc8;
        data_02[3] = local_1ce0;
        local_12e0 = uVar50;
        uStack_12d8 = uVar52;
        local_12d0 = uVar45;
        uStack_12c8 = uVar49;
        convolve_lowbd_x_6tap
                  (data_02,in_stack_ffffffffffffe2f0,
                   (__m256i *)CONCAT44(in_stack_ffffffffffffe2ec,in_stack_ffffffffffffe2e8));
        local_1780._8_8_ = uVar49;
        local_1780._0_8_ = uVar45;
        local_ce0 = local_1460;
        uStack_cd8 = uStack_1458;
        uStack_cd0 = uStack_1450;
        uStack_cc8 = uStack_1448;
        auVar25._16_8_ = uVar50;
        auVar25._0_16_ = local_1780;
        auVar25._24_8_ = uVar52;
        auVar24._8_8_ = uStack_1458;
        auVar24._0_8_ = local_1460;
        auVar24._16_8_ = uStack_1450;
        auVar24._24_8_ = uStack_1448;
        local_fc0 = vpaddw_avx2(auVar25,auVar24);
        local_fd0 = local_1470;
        uStack_fc8 = uStack_1468;
        auVar13._8_8_ = uStack_1468;
        auVar13._0_8_ = local_1470;
        auVar48 = vpsraw_avx2(local_fc0,auVar13);
        local_1780._0_8_ = auVar48._0_8_;
        local_1780._8_8_ = auVar48._8_8_;
        uStack_1770 = auVar48._16_8_;
        uStack_1768 = auVar48._24_8_;
        local_d00 = local_1780._0_8_;
        uStack_cf8 = local_1780._8_8_;
        uStack_cf0 = uStack_1770;
        uStack_ce8 = uStack_1768;
        auVar23._16_8_ = auStack_1490._0_8_;
        auVar23._0_16_ = local_14a0;
        auVar23._24_8_ = auStack_1490._8_8_;
        local_1000 = vpaddw_avx2(auVar48,auVar23);
        local_1010 = local_1440;
        uStack_1008 = uStack_1438;
        auVar12._8_8_ = uStack_1438;
        auVar12._0_8_ = local_1440;
        auVar48 = vpsraw_avx2(local_1000,auVar12);
        local_1780._0_8_ = auVar48._0_8_;
        local_1780._8_8_ = auVar48._8_8_;
        uStack_1770 = auVar48._16_8_;
        uStack_1768 = auVar48._24_8_;
        local_a40 = local_1780._0_8_;
        uStack_a38 = local_1780._8_8_;
        uStack_a30 = uStack_1770;
        uStack_a28 = uStack_1768;
        local_a60 = local_1780._0_8_;
        uStack_a58 = local_1780._8_8_;
        uStack_a50 = uStack_1770;
        uStack_a48 = uStack_1768;
        auVar48 = vpackuswb_avx2(auVar48,auVar48);
        local_17a0 = auVar48._0_8_;
        uStack_1798 = auVar48._8_8_;
        uStack_1790 = auVar48._16_8_;
        uStack_1788 = auVar48._24_8_;
        local_940 = local_17a0;
        uStack_938 = uStack_1798;
        uStack_930 = uStack_1790;
        uStack_928 = uStack_1788;
        local_cc0 = uVar45;
        uStack_cb8 = uVar49;
        uStack_cb0 = uVar50;
        uStack_ca8 = uVar52;
        local_d20 = local_14a0;
        auStack_d10 = auStack_1490;
        if (local_1420 < 5) {
          if (local_1420 < 3) {
            local_690 = local_17a0;
            uStack_688 = uStack_1798;
            local_6a0 = local_17a0;
            uStack_698 = uStack_1798;
            *(short *)(local_1418 + local_14a4 * local_141c) = auVar48._0_2_;
            local_6b0 = uStack_1790;
            uStack_6a8 = uStack_1788;
            local_6c0 = uStack_1790;
            uStack_6b8 = uStack_1788;
            *(short *)(local_1418 + (local_14a4 * local_141c + local_141c)) = auVar48._16_2_;
          }
          else {
            v_01[1] = extraout_RDX_01;
            v_01[0] = (longlong)puVar44;
            xx_storel_32((void *)(local_1418 + local_14a4 * local_141c),v_01);
            v_02[1] = extraout_RDX_02;
            v_02[0] = (longlong)puVar44;
            xx_storel_32((void *)(local_1418 + (local_14a4 * local_141c + local_141c)),v_02);
            local_d20 = local_d20;
            auStack_d10 = auStack_d10;
          }
        }
        else {
          local_808 = (undefined8 *)(local_1418 + local_14a4 * local_141c);
          local_820 = local_17a0;
          uStack_818 = uStack_1798;
          *local_808 = local_17a0;
          local_828 = (undefined8 *)(local_1418 + (local_14a4 * local_141c + local_141c));
          local_840 = uStack_1790;
          uStack_838 = uStack_1788;
          *local_828 = uStack_1790;
        }
      }
    }
    else {
      for (local_14a4 = 0; local_14a4 < local_1424; local_14a4 = local_14a4 + 1) {
        for (local_17d4 = 0; local_17d4 < local_1420; local_17d4 = local_17d4 + 0x10) {
          local_70 = (undefined1 (*) [32])(lVar42 + (local_14a4 * local_140c + local_17d4));
          local_1370 = (undefined1 (*) [16])(lVar42 + (local_17d4 + 8 + local_14a4 * local_140c));
          auVar46 = ZEXT116(0) * *local_1370 + ZEXT116(1) * SUB3216(*local_70,0);
          auVar51 = ZEXT116(0) * SUB3216(*local_70,0x10) + ZEXT116(1) * *local_1370;
          data_03[1] = uStack_1cd0;
          data_03[0] = (longlong)in_stack_ffffffffffffe2f8;
          data_03[2] = uStack_1cc8;
          data_03[3] = local_1ce0;
          convolve_lowbd_x_6tap
                    (data_03,in_stack_ffffffffffffe2f0,
                     (__m256i *)CONCAT44(in_stack_ffffffffffffe2ec,in_stack_ffffffffffffe2e8));
          local_d60 = local_1460;
          uStack_d58 = uStack_1458;
          uStack_d50 = uStack_1450;
          uStack_d48 = uStack_1448;
          auVar22._16_8_ = auVar51._0_8_;
          auVar22._0_16_ = auVar46;
          auVar22._24_8_ = auVar51._8_8_;
          auVar21._8_8_ = uStack_1458;
          auVar21._0_8_ = local_1460;
          auVar21._16_8_ = uStack_1450;
          auVar21._24_8_ = uStack_1448;
          local_1040 = vpaddw_avx2(auVar22,auVar21);
          local_1050 = local_1470;
          uStack_1048 = uStack_1468;
          auVar11._8_8_ = uStack_1468;
          auVar11._0_8_ = local_1470;
          auVar48 = vpsraw_avx2(local_1040,auVar11);
          local_1820 = auVar48._0_8_;
          local_d80 = local_1820;
          uStack_1818 = auVar48._8_8_;
          uStack_d78 = uStack_1818;
          uStack_1810 = auVar48._16_8_;
          uStack_d70 = uStack_1810;
          uStack_1808 = auVar48._24_8_;
          uStack_d68 = uStack_1808;
          uStack_d90 = auStack_1490._0_8_;
          uStack_d88 = auStack_1490._8_8_;
          auVar20._16_8_ = auStack_1490._0_8_;
          auVar20._0_16_ = local_14a0;
          auVar20._24_8_ = auStack_1490._8_8_;
          local_1080 = vpaddw_avx2(auVar48,auVar20);
          local_1090 = local_1440;
          uStack_1088 = uStack_1438;
          auVar10._8_8_ = uStack_1438;
          auVar10._0_8_ = local_1440;
          auVar48 = vpsraw_avx2(local_1080,auVar10);
          local_1820 = auVar48._0_8_;
          local_aa0 = local_1820;
          uStack_1818 = auVar48._8_8_;
          uStack_a98 = uStack_1818;
          uStack_1810 = auVar48._16_8_;
          uStack_a90 = uStack_1810;
          uStack_1808 = auVar48._24_8_;
          uStack_a88 = uStack_1808;
          auVar48 = vpackuswb_avx2(auVar48,auVar48);
          auVar48 = vpermq_avx2(auVar48,0xd8);
          local_1840 = auVar48._0_8_;
          local_960 = local_1840;
          uStack_1838 = auVar48._8_8_;
          uStack_958 = uStack_1838;
          uStack_1830 = auVar48._16_8_;
          uStack_950 = uStack_1830;
          uStack_1828 = auVar48._24_8_;
          uStack_948 = uStack_1828;
          local_8a8 = (undefined8 *)(local_1418 + (local_14a4 * local_141c + local_17d4));
          local_8c0 = local_1840;
          uStack_8b8 = uStack_1838;
          *local_8a8 = local_1840;
          local_8a8[1] = uStack_1838;
          local_a80 = local_aa0;
          uStack_a78 = uStack_a98;
          uStack_a70 = uStack_a90;
          uStack_a68 = uStack_a88;
          local_d40 = auVar46;
          auStack_d30 = auVar51;
          local_da0 = local_14a0;
        }
      }
    }
  }
  else if (local_14a8 == 0xc) {
    lVar42 = local_1408 - (int)((*(ushort *)(in_stack_00000008 + 8) >> 1) - 1);
    local_640 = 0;
    uStack_638 = 0;
    uStack_630 = 0;
    uStack_628 = 0;
    local_604 = (1 << (*(byte *)(CONCAT44(in_stack_0000001c,subpel_x_qn) + 0x14) & 0x1f)) >> 1;
    auVar46 = vpinsrd_avx(ZEXT416(local_604),local_604,1);
    auVar46 = vpinsrd_avx(auVar46,local_604,2);
    local_100 = vpinsrd_avx(auVar46,local_604,3);
    auVar46 = vpinsrd_avx(ZEXT416(local_604),local_604,1);
    auVar46 = vpinsrd_avx(auVar46,local_604,2);
    auStack_f0 = vpinsrd_avx(auVar46,local_604,3);
    local_1460 = local_100._0_8_;
    uStack_1458 = local_100._8_8_;
    uStack_1450 = auStack_f0._0_8_;
    uStack_1448 = auStack_f0._8_8_;
    local_608 = (1 << ((byte)local_1428 & 0x1f)) >> 1;
    auVar46 = vpinsrd_avx(ZEXT416(local_608),local_608,1);
    auVar46 = vpinsrd_avx(auVar46,local_608,2);
    local_c0 = vpinsrd_avx(auVar46,local_608,3);
    auVar46 = vpinsrd_avx(ZEXT416(local_608),local_608,1);
    auVar46 = vpinsrd_avx(auVar46,local_608,2);
    auStack_b0 = vpinsrd_avx(auVar46,local_608,3);
    local_14a0._0_8_ = local_c0._0_8_;
    local_14a0._8_8_ = local_c0._8_8_;
    auStack_1490._0_8_ = auStack_b0._0_8_;
    auStack_1490._8_8_ = auStack_b0._8_8_;
    local_13e4 = *(uint *)(CONCAT44(in_stack_0000001c,subpel_x_qn) + 0x14);
    local_1400._4_4_ = 0;
    local_1400._0_4_ = local_13e4;
    local_1470 = local_1400._0_8_;
    uStack_1468 = 0;
    local_1400 = ZEXT416(local_13e4);
    local_e0 = local_604;
    local_dc = local_604;
    local_d8 = local_604;
    local_d4 = local_604;
    local_d0 = local_604;
    local_cc = local_604;
    local_c8 = local_604;
    local_c4 = local_604;
    local_98 = local_608;
    local_94 = local_608;
    local_90 = local_608;
    local_8c = local_608;
    local_88 = local_608;
    local_84 = local_608;
    local_80 = local_608;
    local_7c = local_608;
    if (local_1420 < 5) {
      for (local_14a4 = 0; local_14a4 < local_1424; local_14a4 = local_14a4 + 2) {
        local_1378 = (undefined1 (*) [16])(lVar42 + local_14a4 * local_140c);
        local_12f0 = *(undefined8 *)*local_1378;
        uStack_12e8 = *(undefined8 *)(*local_1378 + 8);
        local_1380 = (undefined8 *)(lVar42 + (local_14a4 * local_140c + local_140c));
        local_1300 = *local_1380;
        uStack_12f8 = local_1380[1];
        local_1260 = 0;
        uStack_1258 = 0;
        uStack_1250 = 0;
        uStack_1248 = 0;
        auVar5._16_8_ = local_1300;
        auVar5._0_16_ = *local_1378;
        auVar5._24_8_ = uStack_12f8;
        auVar1 = vpunpcklbw_avx2(auVar5,ZEXT1632(ZEXT816(0)));
        local_11e0 = 0;
        uStack_11d8 = 0;
        uStack_11d0 = 0;
        uStack_11c8 = 0;
        auVar7._16_8_ = local_1300;
        auVar7._0_16_ = *local_1378;
        auVar7._24_8_ = uStack_12f8;
        auVar48 = vpunpckhbw_avx2(auVar7,ZEXT1632(ZEXT816(0)));
        local_1980 = auVar1._0_8_;
        uStack_1978 = auVar1._8_8_;
        uStack_1970 = auVar1._16_8_;
        uStack_1968 = auVar1._24_8_;
        local_520 = local_1980;
        uStack_518 = uStack_1978;
        uStack_510 = uStack_1970;
        uStack_508 = uStack_1968;
        local_540 = local_1980;
        uStack_538 = uStack_1978;
        uStack_530 = uStack_1970;
        uStack_528 = uStack_1968;
        auVar2 = vpunpcklwd_avx2(auVar1,auVar1);
        local_420 = local_1980;
        uStack_418 = uStack_1978;
        uStack_410 = uStack_1970;
        uStack_408 = uStack_1968;
        local_440 = local_1980;
        uStack_438 = uStack_1978;
        uStack_430 = uStack_1970;
        uStack_428 = uStack_1968;
        auVar1 = vpunpckhwd_avx2(auVar1,auVar1);
        local_19a0 = auVar48._0_8_;
        uStack_1998 = auVar48._8_8_;
        uStack_1990 = auVar48._16_8_;
        uStack_1988 = auVar48._24_8_;
        local_560 = local_19a0;
        uStack_558 = uStack_1998;
        uStack_550 = uStack_1990;
        uStack_548 = uStack_1988;
        local_580 = local_19a0;
        uStack_578 = uStack_1998;
        uStack_570 = uStack_1990;
        uStack_568 = uStack_1988;
        auVar3 = vpunpcklwd_avx2(auVar48,auVar48);
        local_460 = local_19a0;
        uStack_458 = uStack_1998;
        uStack_450 = uStack_1990;
        uStack_448 = uStack_1988;
        local_480 = local_19a0;
        uStack_478 = uStack_1998;
        uStack_470 = uStack_1990;
        uStack_468 = uStack_1988;
        auVar48 = vpunpckhwd_avx2(auVar48,auVar48);
        vpalignr_avx2(auVar1,auVar2,2);
        vpalignr_avx2(auVar1,auVar2,10);
        vpalignr_avx2(auVar3,auVar1,2);
        vpalignr_avx2(auVar3,auVar1,10);
        vpalignr_avx2(auVar48,auVar3,2);
        auVar48 = vpalignr_avx2(auVar48,auVar3,10);
        local_1240 = local_12f0;
        uStack_1238 = uStack_12e8;
        uStack_1230 = local_1300;
        uStack_1228 = uStack_12f8;
        local_11c0 = local_12f0;
        uStack_11b8 = uStack_12e8;
        uStack_11b0 = local_1300;
        uStack_11a8 = uStack_12f8;
        convolve_12taps(in_stack_ffffffffffffe370,in_stack_ffffffffffffe368);
        uVar49 = local_6e0;
        uVar45 = local_700;
        local_1a40 = auVar48._0_8_;
        local_220 = local_1a40;
        uStack_1a38 = auVar48._8_8_;
        uStack_218 = uStack_1a38;
        uStack_1a30 = auVar48._16_8_;
        uStack_210 = uStack_1a30;
        uStack_1a28 = auVar48._24_8_;
        uStack_208 = uStack_1a28;
        local_240 = local_1460;
        uStack_238 = uStack_1458;
        uStack_230 = uStack_1450;
        uStack_228 = uStack_1448;
        auVar39._8_8_ = uStack_1458;
        auVar39._0_8_ = local_1460;
        auVar39._16_8_ = uStack_1450;
        auVar39._24_8_ = uStack_1448;
        local_320 = vpaddd_avx2(auVar48,auVar39);
        local_330 = local_1470;
        uStack_328 = uStack_1468;
        auVar35._8_8_ = uStack_1468;
        auVar35._0_8_ = local_1470;
        auVar48 = vpsrad_avx2(local_320,auVar35);
        local_1a60 = auVar48._0_8_;
        local_260 = local_1a60;
        uStack_1a58 = auVar48._8_8_;
        uStack_258 = uStack_1a58;
        uStack_1a50 = auVar48._16_8_;
        uStack_250 = uStack_1a50;
        uStack_1a48 = auVar48._24_8_;
        uStack_248 = uStack_1a48;
        local_280 = local_14a0._0_8_;
        uStack_278 = local_14a0._8_8_;
        uStack_270 = auStack_1490._0_8_;
        uStack_268 = auStack_1490._8_8_;
        auVar38._8_8_ = local_14a0._8_8_;
        auVar38._0_8_ = local_14a0._0_8_;
        auVar38._16_8_ = auStack_1490._0_8_;
        auVar38._24_8_ = auStack_1490._8_8_;
        local_360 = vpaddd_avx2(auVar48,auVar38);
        local_370 = local_1440;
        uStack_368 = uStack_1438;
        auVar34._8_8_ = uStack_1438;
        auVar34._0_8_ = local_1440;
        auVar48 = vpsrad_avx2(local_360,auVar34);
        local_1a60 = auVar48._0_8_;
        local_1c0 = local_1a60;
        uStack_1a58 = auVar48._8_8_;
        uStack_1b8 = uStack_1a58;
        uStack_1a50 = auVar48._16_8_;
        uStack_1b0 = uStack_1a50;
        uStack_1a48 = auVar48._24_8_;
        uStack_1a8 = uStack_1a48;
        auVar48 = vpackssdw_avx2(auVar48,auVar48);
        local_1a80 = auVar48._0_8_;
        local_ae0 = local_1a80;
        uStack_1a78 = auVar48._8_8_;
        uStack_ad8 = uStack_1a78;
        uStack_1a70 = auVar48._16_8_;
        uStack_ad0 = uStack_1a70;
        uStack_1a68 = auVar48._24_8_;
        uStack_ac8 = uStack_1a68;
        auVar48 = vpackuswb_avx2(auVar48,auVar48);
        local_1aa0 = auVar48._0_8_;
        uStack_1a98 = auVar48._8_8_;
        uStack_1a90 = auVar48._16_8_;
        uStack_1a88 = auVar48._24_8_;
        local_6e0._0_4_ = auVar48._0_4_;
        uVar41 = (undefined4)local_6e0;
        local_700._0_4_ = auVar48._16_4_;
        uVar40 = (undefined4)local_700;
        if (local_1420 < 3) {
          local_710 = local_1aa0;
          uStack_708 = uStack_1a98;
          local_720 = local_1aa0;
          uStack_718 = uStack_1a98;
          *(short *)(local_1418 + local_14a4 * local_141c) = auVar48._0_2_;
          local_730 = uStack_1a90;
          uStack_728 = uStack_1a88;
          local_740 = uStack_1a90;
          uStack_738 = uStack_1a88;
          *(short *)(local_1418 + (local_14a4 * local_141c + local_141c)) = auVar48._16_2_;
          local_700 = uVar45;
          local_6e0 = uVar49;
        }
        else {
          local_6d0 = local_1aa0;
          uStack_6c8 = uStack_1a98;
          local_6e0 = local_1aa0;
          uStack_6d8 = uStack_1a98;
          *(undefined4 *)(local_1418 + local_14a4 * local_141c) = uVar41;
          local_6f0 = uStack_1a90;
          uStack_6e8 = uStack_1a88;
          local_700 = uStack_1a90;
          uStack_6f8 = uStack_1a88;
          *(undefined4 *)(local_1418 + (local_14a4 * local_141c + local_141c)) = uVar40;
        }
        local_ac0 = local_ae0;
        uStack_ab8 = uStack_ad8;
        uStack_ab0 = uStack_ad0;
        uStack_aa8 = uStack_ac8;
        local_1a0 = local_1c0;
        uStack_198 = uStack_1b8;
        uStack_190 = uStack_1b0;
        uStack_188 = uStack_1a8;
      }
    }
    else {
      for (local_14a4 = 0; local_14a4 < local_1424; local_14a4 = local_14a4 + 1) {
        for (local_1ac4 = 0; local_1ac4 < local_1420; local_1ac4 = local_1ac4 + 8) {
          local_1388 = (undefined1 (*) [16])(lVar42 + (local_14a4 * local_140c + local_1ac4));
          local_1310 = *(undefined8 *)*local_1388;
          uStack_1308 = *(undefined8 *)(*local_1388 + 8);
          local_1390 = (undefined8 *)((long)(local_14a4 * local_140c + local_1ac4) + 4 + lVar42);
          local_1320 = *local_1390;
          uStack_1318 = local_1390[1];
          local_12a0 = 0;
          uStack_1298 = 0;
          uStack_1290 = 0;
          uStack_1288 = 0;
          auVar4._16_8_ = local_1320;
          auVar4._0_16_ = *local_1388;
          auVar4._24_8_ = uStack_1318;
          auVar1 = vpunpcklbw_avx2(auVar4,ZEXT1632(ZEXT816(0)));
          local_1220 = 0;
          uStack_1218 = 0;
          uStack_1210 = 0;
          uStack_1208 = 0;
          auVar6._16_8_ = local_1320;
          auVar6._0_16_ = *local_1388;
          auVar6._24_8_ = uStack_1318;
          auVar48 = vpunpckhbw_avx2(auVar6,ZEXT1632(ZEXT816(0)));
          local_1b20 = auVar1._0_8_;
          uStack_1b18 = auVar1._8_8_;
          uStack_1b10 = auVar1._16_8_;
          uStack_1b08 = auVar1._24_8_;
          local_5a0 = local_1b20;
          uStack_598 = uStack_1b18;
          uStack_590 = uStack_1b10;
          uStack_588 = uStack_1b08;
          local_5c0 = local_1b20;
          uStack_5b8 = uStack_1b18;
          uStack_5b0 = uStack_1b10;
          uStack_5a8 = uStack_1b08;
          auVar2 = vpunpcklwd_avx2(auVar1,auVar1);
          local_4a0 = local_1b20;
          uStack_498 = uStack_1b18;
          uStack_490 = uStack_1b10;
          uStack_488 = uStack_1b08;
          local_4c0 = local_1b20;
          uStack_4b8 = uStack_1b18;
          uStack_4b0 = uStack_1b10;
          uStack_4a8 = uStack_1b08;
          auVar1 = vpunpckhwd_avx2(auVar1,auVar1);
          local_1b40 = auVar48._0_8_;
          uStack_1b38 = auVar48._8_8_;
          uStack_1b30 = auVar48._16_8_;
          uStack_1b28 = auVar48._24_8_;
          local_5e0 = local_1b40;
          uStack_5d8 = uStack_1b38;
          uStack_5d0 = uStack_1b30;
          uStack_5c8 = uStack_1b28;
          local_600 = local_1b40;
          uStack_5f8 = uStack_1b38;
          uStack_5f0 = uStack_1b30;
          uStack_5e8 = uStack_1b28;
          auVar3 = vpunpcklwd_avx2(auVar48,auVar48);
          local_4e0 = local_1b40;
          uStack_4d8 = uStack_1b38;
          uStack_4d0 = uStack_1b30;
          uStack_4c8 = uStack_1b28;
          local_500 = local_1b40;
          uStack_4f8 = uStack_1b38;
          uStack_4f0 = uStack_1b30;
          uStack_4e8 = uStack_1b28;
          auVar48 = vpunpckhwd_avx2(auVar48,auVar48);
          vpalignr_avx2(auVar1,auVar2,2);
          vpalignr_avx2(auVar1,auVar2,10);
          vpalignr_avx2(auVar3,auVar1,2);
          vpalignr_avx2(auVar3,auVar1,10);
          vpalignr_avx2(auVar48,auVar3,2);
          auVar48 = vpalignr_avx2(auVar48,auVar3,10);
          local_1280 = local_1310;
          uStack_1278 = uStack_1308;
          uStack_1270 = local_1320;
          uStack_1268 = uStack_1318;
          local_1200 = local_1310;
          uStack_11f8 = uStack_1308;
          uStack_11f0 = local_1320;
          uStack_11e8 = uStack_1318;
          convolve_12taps(in_stack_ffffffffffffe370,in_stack_ffffffffffffe368);
          local_1be0 = auVar48._0_8_;
          local_2a0 = local_1be0;
          uStack_1bd8 = auVar48._8_8_;
          uStack_298 = uStack_1bd8;
          uStack_1bd0 = auVar48._16_8_;
          uStack_290 = uStack_1bd0;
          uStack_1bc8 = auVar48._24_8_;
          uStack_288 = uStack_1bc8;
          local_2c0 = local_1460;
          uStack_2b8 = uStack_1458;
          uStack_2b0 = uStack_1450;
          uStack_2a8 = uStack_1448;
          auVar37._8_8_ = uStack_1458;
          auVar37._0_8_ = local_1460;
          auVar37._16_8_ = uStack_1450;
          auVar37._24_8_ = uStack_1448;
          local_3a0 = vpaddd_avx2(auVar48,auVar37);
          local_3b0 = local_1470;
          uStack_3a8 = uStack_1468;
          auVar33._8_8_ = uStack_1468;
          auVar33._0_8_ = local_1470;
          auVar48 = vpsrad_avx2(local_3a0,auVar33);
          local_1c00 = auVar48._0_8_;
          local_2e0 = local_1c00;
          uStack_1bf8 = auVar48._8_8_;
          uStack_2d8 = uStack_1bf8;
          uStack_1bf0 = auVar48._16_8_;
          uStack_2d0 = uStack_1bf0;
          uStack_1be8 = auVar48._24_8_;
          uStack_2c8 = uStack_1be8;
          local_300 = local_14a0._0_8_;
          uStack_2f8 = local_14a0._8_8_;
          uStack_2f0 = auStack_1490._0_8_;
          uStack_2e8 = auStack_1490._8_8_;
          auVar36._8_8_ = local_14a0._8_8_;
          auVar36._0_8_ = local_14a0._0_8_;
          auVar36._16_8_ = auStack_1490._0_8_;
          auVar36._24_8_ = auStack_1490._8_8_;
          local_3e0 = vpaddd_avx2(auVar48,auVar36);
          local_3f0 = local_1440;
          uStack_3e8 = uStack_1438;
          auVar32._8_8_ = uStack_1438;
          auVar32._0_8_ = local_1440;
          auVar48 = vpsrad_avx2(local_3e0,auVar32);
          local_1c00 = auVar48._0_8_;
          local_200 = local_1c00;
          uStack_1bf8 = auVar48._8_8_;
          uStack_1f8 = uStack_1bf8;
          uStack_1bf0 = auVar48._16_8_;
          uStack_1f0 = uStack_1bf0;
          uStack_1be8 = auVar48._24_8_;
          uStack_1e8 = uStack_1be8;
          auVar48 = vpackssdw_avx2(auVar48,auVar48);
          local_1c20 = auVar48._0_8_;
          local_b20 = local_1c20;
          uStack_1c18 = auVar48._8_8_;
          uStack_b18 = uStack_1c18;
          uStack_1c10 = auVar48._16_8_;
          uStack_b10 = uStack_1c10;
          uStack_1c08 = auVar48._24_8_;
          uStack_b08 = uStack_1c08;
          auVar48 = vpackuswb_avx2(auVar48,auVar48);
          uStack_1c28 = auVar48._24_8_;
          uStack_758 = uStack_1c28;
          uStack_1c30 = auVar48._16_8_;
          local_750 = uStack_1c30;
          local_760._0_4_ = auVar48._16_4_;
          *(undefined4 *)(local_1418 + (local_14a4 * local_141c + local_1ac4)) =
               (undefined4)local_760;
          *(undefined4 *)(local_1418 + (local_14a4 * local_141c + local_1ac4 + 4)) = local_1c60;
          local_b00 = local_b20;
          uStack_af8 = uStack_b18;
          uStack_af0 = uStack_b10;
          uStack_ae8 = uStack_b08;
          local_760 = local_750;
          uStack_748 = uStack_758;
          local_1e0 = local_200;
          uStack_1d8 = uStack_1f8;
          uStack_1d0 = uStack_1f0;
          uStack_1c8 = uStack_1e8;
        }
      }
    }
  }
  else {
    lVar42 = local_1408 - (int)(*(ushort *)(in_stack_00000008 + 8) / 2 - 1);
    local_58 = 
    "\x04\x05\x05\x06\x06\a\a\b\b\t\t\n\n\v\v\f\x04\x05\x05\x06\x06\a\a\b\b\t\t\n\n\v\v\f\x06\a\a\b\b\t\t\n\n\v\v\f\f\r\r\x0e\x06\a\a\b\b\t\t\n\n\v\v\f\f\r\r\x0e"
    ;
    local_15c0[0] = '\x04';
    local_15c0[1] = '\x05';
    local_15c0[2] = '\x05';
    local_15c0[3] = '\x06';
    local_15c0[4] = '\x06';
    local_15c0[5] = '\a';
    local_15c0[6] = '\a';
    local_15c0[7] = '\b';
    auStack_15b8[0] = '\b';
    auStack_15b8[1] = '\t';
    auStack_15b8[2] = '\t';
    auStack_15b8[3] = '\n';
    auStack_15b8[4] = '\n';
    auStack_15b8[5] = '\v';
    auStack_15b8[6] = '\v';
    auStack_15b8[7] = '\f';
    auStack_15b0[0] = '\x04';
    auStack_15b0[1] = '\x05';
    auStack_15b0[2] = '\x05';
    auStack_15b0[3] = '\x06';
    auStack_15b0[4] = '\x06';
    auStack_15b0[5] = '\a';
    auStack_15b0[6] = '\a';
    auStack_15b0[7] = '\b';
    auStack_15a8[0] = '\b';
    auStack_15a8[1] = '\t';
    auStack_15a8[2] = '\t';
    auStack_15a8[3] = '\n';
    auStack_15a8[4] = '\n';
    auStack_15a8[5] = '\v';
    auStack_15a8[6] = '\v';
    auStack_15a8[7] = '\f';
    local_60 = "\x06\a\a\b\b\t\t\n\n\v\v\f\f\r\r\x0e\x06\a\a\b\b\t\t\n\n\v\v\f\f\r\r\x0e";
    local_15a0[0] = '\x06';
    local_15a0[1] = '\a';
    local_15a0[2] = '\a';
    local_15a0[3] = '\b';
    local_15a0[4] = '\b';
    local_15a0[5] = '\t';
    local_15a0[6] = '\t';
    local_15a0[7] = '\n';
    auStack_1598[0] = '\n';
    auStack_1598[1] = '\v';
    auStack_1598[2] = '\v';
    auStack_1598[3] = '\f';
    auStack_1598[4] = '\f';
    auStack_1598[5] = '\r';
    auStack_1598[6] = '\r';
    auStack_1598[7] = '\x0e';
    auStack_1590[0] = '\x06';
    auStack_1590[1] = '\a';
    auStack_1590[2] = '\a';
    auStack_1590[3] = '\b';
    auStack_1590[4] = '\b';
    auStack_1590[5] = '\t';
    auStack_1590[6] = '\t';
    auStack_1590[7] = '\n';
    auStack_1588[0] = '\n';
    auStack_1588[1] = '\v';
    auStack_1588[2] = '\v';
    auStack_1588[3] = '\f';
    auStack_1588[4] = '\f';
    auStack_1588[5] = '\r';
    auStack_1588[6] = '\r';
    auStack_1588[7] = '\x0e';
    if (local_1420 < 9) {
      for (local_14a4 = 0; local_14a4 < local_1424; local_14a4 = local_14a4 + 2) {
        local_1398 = (undefined8 *)(lVar42 + local_14a4 * local_140c);
        uVar45 = *local_1398;
        uVar49 = local_1398[1];
        local_13a0 = (undefined8 *)(lVar42 + (local_14a4 * local_140c + local_140c));
        uVar50 = *local_13a0;
        uVar52 = local_13a0[1];
        puVar44 = local_1600;
        data_04[1] = uStack_1cd0;
        data_04[0] = (longlong)in_stack_ffffffffffffe2f8;
        data_04[2] = uStack_1cc8;
        data_04[3] = local_1ce0;
        local_1340 = uVar50;
        uStack_1338 = uVar52;
        local_1330 = uVar45;
        uStack_1328 = uVar49;
        convolve_lowbd_x(data_04,in_stack_ffffffffffffe2f0,
                         (__m256i *)CONCAT44(in_stack_ffffffffffffe2ec,in_stack_ffffffffffffe2e8));
        local_1cc0._8_8_ = uVar49;
        local_1cc0._0_8_ = uVar45;
        local_de0 = local_1460;
        uStack_dd8 = uStack_1458;
        uStack_dd0 = uStack_1450;
        uStack_dc8 = uStack_1448;
        auVar19._16_8_ = uVar50;
        auVar19._0_16_ = local_1cc0;
        auVar19._24_8_ = uVar52;
        auVar18._8_8_ = uStack_1458;
        auVar18._0_8_ = local_1460;
        auVar18._16_8_ = uStack_1450;
        auVar18._24_8_ = uStack_1448;
        local_10c0 = vpaddw_avx2(auVar19,auVar18);
        local_10d0 = local_1470;
        uStack_10c8 = uStack_1468;
        auVar9._8_8_ = uStack_1468;
        auVar9._0_8_ = local_1470;
        auVar48 = vpsraw_avx2(local_10c0,auVar9);
        local_1cc0._0_8_ = auVar48._0_8_;
        local_1cc0._8_8_ = auVar48._8_8_;
        uStack_1cb0 = auVar48._16_8_;
        uStack_1ca8 = auVar48._24_8_;
        local_e00 = local_1cc0._0_8_;
        uStack_df8 = local_1cc0._8_8_;
        uStack_df0 = uStack_1cb0;
        uStack_de8 = uStack_1ca8;
        auVar3._16_8_ = auStack_1490._0_8_;
        auVar3._0_16_ = local_14a0;
        auVar3._24_8_ = auStack_1490._8_8_;
        local_1100 = vpaddw_avx2(auVar48,auVar3);
        local_1110 = local_1440;
        uStack_1108 = uStack_1438;
        auVar47._8_8_ = uStack_1438;
        auVar47._0_8_ = local_1440;
        auVar48 = vpsraw_avx2(local_1100,auVar47);
        local_1cc0._0_8_ = auVar48._0_8_;
        local_1cc0._8_8_ = auVar48._8_8_;
        uStack_1cb0 = auVar48._16_8_;
        uStack_1ca8 = auVar48._24_8_;
        local_b40 = local_1cc0._0_8_;
        uStack_b38 = local_1cc0._8_8_;
        uStack_b30 = uStack_1cb0;
        uStack_b28 = uStack_1ca8;
        local_b60 = local_1cc0._0_8_;
        uStack_b58 = local_1cc0._8_8_;
        uStack_b50 = uStack_1cb0;
        uStack_b48 = uStack_1ca8;
        auVar48 = vpackuswb_avx2(auVar48,auVar48);
        local_1ce0 = auVar48._0_8_;
        uStack_1cd8 = auVar48._8_8_;
        uStack_1cd0 = auVar48._16_8_;
        uStack_1cc8 = auVar48._24_8_;
        local_980 = local_1ce0;
        uStack_978 = uStack_1cd8;
        uStack_970 = uStack_1cd0;
        uStack_968 = uStack_1cc8;
        local_dc0 = uVar45;
        uStack_db8 = uVar49;
        uStack_db0 = uVar50;
        uStack_da8 = uVar52;
        local_e20 = local_14a0;
        auStack_e10 = auStack_1490;
        if (local_1420 < 5) {
          if (local_1420 < 3) {
            in_stack_ffffffffffffe2f8 = (undefined2 *)(local_1418 + local_14a4 * local_141c);
            in_stack_ffffffffffffe2f0 =
                 (__m256i *)(local_1418 + (local_14a4 * local_141c + local_141c));
            local_790 = local_1ce0;
            uStack_788 = uStack_1cd8;
            local_7a0 = local_1ce0;
            uStack_798 = uStack_1cd8;
            *in_stack_ffffffffffffe2f8 = auVar48._0_2_;
            local_7b0 = uStack_1cd0;
            uStack_7a8 = uStack_1cc8;
            local_7c0 = uStack_1cd0;
            uStack_7b8 = uStack_1cc8;
            *(short *)*in_stack_ffffffffffffe2f0 = auVar48._16_2_;
          }
          else {
            v_03[1] = extraout_RDX_03;
            v_03[0] = (longlong)puVar44;
            xx_storel_32((void *)(local_1418 + local_14a4 * local_141c),v_03);
            v_04[1] = extraout_RDX_04;
            v_04[0] = (longlong)puVar44;
            xx_storel_32((void *)(local_1418 + (local_14a4 * local_141c + local_141c)),v_04);
            local_e20 = local_e20;
            auStack_e10 = auStack_e10;
          }
        }
        else {
          local_848 = (longlong *)(local_1418 + local_14a4 * local_141c);
          local_860 = local_1ce0;
          uStack_858 = uStack_1cd8;
          *local_848 = local_1ce0;
          local_868 = (undefined8 *)(local_1418 + (local_14a4 * local_141c + local_141c));
          local_880 = uStack_1cd0;
          uStack_878 = uStack_1cc8;
          *local_868 = uStack_1cd0;
        }
      }
    }
    else {
      for (local_14a4 = 0; local_14a4 < local_1424; local_14a4 = local_14a4 + 1) {
        for (iVar53 = 0; uStack_e28 = auVar46._8_8_, iVar53 < local_1420; iVar53 = iVar53 + 0x10) {
          local_78 = (undefined1 (*) [32])(lVar42 + (local_14a4 * local_140c + iVar53));
          local_13a8 = (undefined1 (*) [16])(lVar42 + (iVar53 + 8 + local_14a4 * local_140c));
          auVar47 = ZEXT116(0) * *local_13a8 + ZEXT116(1) * SUB3216(*local_78,0);
          auVar46 = ZEXT116(0) * SUB3216(*local_78,0x10) + ZEXT116(1) * *local_13a8;
          uVar45 = auVar46._0_8_;
          data_05[1] = uStack_1cd0;
          data_05[0] = (longlong)in_stack_ffffffffffffe2f8;
          data_05[2] = uStack_1cc8;
          data_05[3] = local_1ce0;
          convolve_lowbd_x(data_05,in_stack_ffffffffffffe2f0,
                           (__m256i *)CONCAT44(iVar53,in_stack_ffffffffffffe2e8));
          local_e60 = local_1460;
          uStack_e58 = uStack_1458;
          uStack_e50 = uStack_1450;
          uStack_e48 = uStack_1448;
          auVar2._16_8_ = uVar45;
          auVar2._0_16_ = auVar47;
          auVar2._24_8_ = auVar46._8_8_;
          auVar48._8_8_ = uStack_1458;
          auVar48._0_8_ = local_1460;
          auVar48._16_8_ = uStack_1450;
          auVar48._24_8_ = uStack_1448;
          local_1140 = vpaddw_avx2(auVar2,auVar48);
          local_1150 = local_1470;
          uStack_1148 = uStack_1468;
          auVar8._8_8_ = uStack_1468;
          auVar8._0_8_ = local_1470;
          auVar48 = vpsraw_avx2(local_1140,auVar8);
          local_1d60 = auVar48._0_8_;
          uStack_e78 = auVar48._8_8_;
          local_e80 = local_1d60;
          uStack_e70 = auVar48._16_8_;
          uStack_e68 = auVar48._24_8_;
          uStack_e90 = auStack_1490._0_8_;
          uStack_e88 = auStack_1490._8_8_;
          auVar1._16_8_ = auStack_1490._0_8_;
          auVar1._0_16_ = local_14a0;
          auVar1._24_8_ = auStack_1490._8_8_;
          local_1180 = vpaddw_avx2(auVar48,auVar1);
          local_1190 = local_1440;
          uStack_1188 = uStack_1438;
          auVar51._8_8_ = uStack_1438;
          auVar51._0_8_ = local_1440;
          auVar48 = vpsraw_avx2(local_1180,auVar51);
          local_1d60 = auVar48._0_8_;
          uStack_b98 = auVar48._8_8_;
          local_ba0 = local_1d60;
          uStack_b90 = auVar48._16_8_;
          uStack_b88 = auVar48._24_8_;
          auVar48 = vpackuswb_avx2(auVar48,auVar48);
          auVar48 = vpermq_avx2(auVar48,0xd8);
          local_1d80 = auVar48._0_8_;
          local_9a0 = local_1d80;
          uStack_1d78 = auVar48._8_8_;
          uStack_998 = uStack_1d78;
          uStack_1d70 = auVar48._16_8_;
          uStack_990 = uStack_1d70;
          uStack_1d68 = auVar48._24_8_;
          uStack_988 = uStack_1d68;
          local_8c8 = (undefined8 *)(local_1418 + (local_14a4 * local_141c + iVar53));
          local_8e0 = local_1d80;
          uStack_8d8 = uStack_1d78;
          *local_8c8 = local_1d80;
          local_8c8[1] = uStack_1d78;
          uStack_e30 = uVar45;
          local_b80 = local_ba0;
          uStack_b78 = uStack_b98;
          uStack_b70 = uStack_b90;
          uStack_b68 = uStack_b88;
          local_ea0 = local_14a0;
          local_e40 = auVar47;
        }
      }
    }
  }
  return;
}

Assistant:

static inline void av1_convolve_x_sr_general_avx2(
    const uint8_t *src, int src_stride, uint8_t *dst, int dst_stride, int w,
    int h, const InterpFilterParams *filter_params_x, const int subpel_x_qn,
    ConvolveParams *conv_params) {
  const int bits = FILTER_BITS - conv_params->round_0;
  const __m128i round_shift = _mm_cvtsi32_si128(bits);
  __m256i round_0_const =
      _mm256_set1_epi16((1 << (conv_params->round_0 - 1)) >> 1);
  __m128i round_0_shift = _mm_cvtsi32_si128(conv_params->round_0 - 1);
  __m256i round_const = _mm256_set1_epi16((1 << bits) >> 1);
  int i, horiz_tap = get_filter_tap(filter_params_x, subpel_x_qn);

  assert(bits >= 0);
  assert((FILTER_BITS - conv_params->round_1) >= 0 ||
         ((conv_params->round_0 + conv_params->round_1) == 2 * FILTER_BITS));
  assert(conv_params->round_0 > 0);

  __m256i coeffs[6], filt[4];
  filt[0] = _mm256_load_si256((__m256i const *)(filt_global_avx2));
  filt[1] = _mm256_load_si256((__m256i const *)(filt_global_avx2 + 32));

  if (horiz_tap == 6)
    prepare_coeffs_6t_lowbd(filter_params_x, subpel_x_qn, coeffs);
  else if (horiz_tap == 12) {
    prepare_coeffs_12taps(filter_params_x, subpel_x_qn, coeffs);
  } else {
    prepare_coeffs_lowbd(filter_params_x, subpel_x_qn, coeffs);
  }

  // horz_filt as 4 tap
  if (horiz_tap == 4) {
    const int fo_horiz = 1;
    const uint8_t *const src_ptr = src - fo_horiz;
    if (w <= 8) {
      for (i = 0; i < h; i += 2) {
        const __m256i data = _mm256_permute2x128_si256(
            _mm256_castsi128_si256(
                _mm_loadu_si128((__m128i *)(&src_ptr[i * src_stride]))),
            _mm256_castsi128_si256(_mm_loadu_si128(
                (__m128i *)(&src_ptr[i * src_stride + src_stride]))),
            0x20);

        __m256i res_16b = convolve_lowbd_x_4tap(data, coeffs + 1, filt);

        res_16b = _mm256_sra_epi16(_mm256_add_epi16(res_16b, round_0_const),
                                   round_0_shift);

        res_16b = _mm256_sra_epi16(_mm256_add_epi16(res_16b, round_const),
                                   round_shift);

        /* rounding code */
        // 8 bit conversion and saturation to uint8
        __m256i res_8b = _mm256_packus_epi16(res_16b, res_16b);

        const __m128i res_0 = _mm256_castsi256_si128(res_8b);
        const __m128i res_1 = _mm256_extracti128_si256(res_8b, 1);

        if (w > 4) {
          _mm_storel_epi64((__m128i *)&dst[i * dst_stride], res_0);
          _mm_storel_epi64((__m128i *)&dst[i * dst_stride + dst_stride], res_1);
        } else if (w > 2) {
          xx_storel_32(&dst[i * dst_stride], res_0);
          xx_storel_32(&dst[i * dst_stride + dst_stride], res_1);
        } else {
          __m128i *const p_0 = (__m128i *)&dst[i * dst_stride];
          __m128i *const p_1 = (__m128i *)&dst[i * dst_stride + dst_stride];
          *(uint16_t *)p_0 = (uint16_t)_mm_cvtsi128_si32(res_0);
          *(uint16_t *)p_1 = (uint16_t)_mm_cvtsi128_si32(res_1);
        }
      }
    } else {
      for (i = 0; i < h; ++i) {
        for (int j = 0; j < w; j += 16) {
          // 0 1 2 3 4 5 6 7 8 9 10 11 12 13 14 15 8 9 10 11 12 13 14 15 16 17
          // 18 19 20 21 22 23
          const __m256i data = _mm256_inserti128_si256(
              _mm256_loadu_si256((__m256i *)&src_ptr[(i * src_stride) + j]),
              _mm_loadu_si128((__m128i *)&src_ptr[(i * src_stride) + (j + 8)]),
              1);

          __m256i res_16b = convolve_lowbd_x_4tap(data, coeffs + 1, filt);

          res_16b = _mm256_sra_epi16(_mm256_add_epi16(res_16b, round_0_const),
                                     round_0_shift);

          res_16b = _mm256_sra_epi16(_mm256_add_epi16(res_16b, round_const),
                                     round_shift);

          /* rounding code */
          // 8 bit conversion and saturation to uint8
          __m256i res_8b = _mm256_packus_epi16(res_16b, res_16b);

          // Store values into the destination buffer
          // 0 1 2 3 4 5 6 7 8 9 10 11 12 13 14 15
          res_8b = _mm256_permute4x64_epi64(res_8b, 216);
          __m128i res = _mm256_castsi256_si128(res_8b);
          _mm_storeu_si128((__m128i *)&dst[i * dst_stride + j], res);
        }
      }
    }
  } else if (horiz_tap == 6) {
    const int fo_horiz = horiz_tap / 2 - 1;
    const uint8_t *const src_ptr = src - fo_horiz;
    filt[2] = _mm256_load_si256((__m256i const *)(filt_global_avx2 + 32 * 2));
    filt[3] = _mm256_load_si256((__m256i const *)(filt_global_avx2 + 32 * 3));

    if (w <= 8) {
      for (i = 0; i < h; i += 2) {
        const __m256i data = _mm256_permute2x128_si256(
            _mm256_castsi128_si256(
                _mm_loadu_si128((__m128i *)(&src_ptr[i * src_stride]))),
            _mm256_castsi128_si256(_mm_loadu_si128(
                (__m128i *)(&src_ptr[i * src_stride + src_stride]))),
            0x20);

        __m256i res_16b = convolve_lowbd_x_6tap(data, coeffs, filt);

        res_16b = _mm256_sra_epi16(_mm256_add_epi16(res_16b, round_0_const),
                                   round_0_shift);

        res_16b = _mm256_sra_epi16(_mm256_add_epi16(res_16b, round_const),
                                   round_shift);

        /* rounding code */
        // 8 bit conversion and saturation to uint8
        __m256i res_8b = _mm256_packus_epi16(res_16b, res_16b);

        const __m128i res_0 = _mm256_castsi256_si128(res_8b);
        const __m128i res_1 = _mm256_extracti128_si256(res_8b, 1);
        if (w > 4) {
          _mm_storel_epi64((__m128i *)&dst[i * dst_stride], res_0);
          _mm_storel_epi64((__m128i *)&dst[i * dst_stride + dst_stride], res_1);
        } else if (w > 2) {
          xx_storel_32(&dst[i * dst_stride], res_0);
          xx_storel_32(&dst[i * dst_stride + dst_stride], res_1);
        } else {
          __m128i *const p_0 = (__m128i *)&dst[i * dst_stride];
          __m128i *const p_1 = (__m128i *)&dst[i * dst_stride + dst_stride];
          *(uint16_t *)p_0 = _mm_cvtsi128_si32(res_0);
          *(uint16_t *)p_1 = _mm_cvtsi128_si32(res_1);
        }
      }
    } else {
      for (i = 0; i < h; ++i) {
        for (int j = 0; j < w; j += 16) {
          // 0 1 2 3 4 5 6 7 8 9 10 11 12 13 14 15 8 9 10 11 12 13 14 15 16 17
          // 18 19 20 21 22 23
          const __m256i data = _mm256_inserti128_si256(
              _mm256_loadu_si256((__m256i *)&src_ptr[(i * src_stride) + j]),
              _mm_loadu_si128((__m128i *)&src_ptr[(i * src_stride) + (j + 8)]),
              1);

          __m256i res_16b = convolve_lowbd_x_6tap(data, coeffs, filt);

          res_16b = _mm256_sra_epi16(_mm256_add_epi16(res_16b, round_0_const),
                                     round_0_shift);

          res_16b = _mm256_sra_epi16(_mm256_add_epi16(res_16b, round_const),
                                     round_shift);

          /* rounding code */
          // 8 bit conversion and saturation to uint8
          __m256i res_8b = _mm256_packus_epi16(res_16b, res_16b);

          // Store values into the destination buffer
          // 0 1 2 3 4 5 6 7 8 9 10 11 12 13 14 15
          res_8b = _mm256_permute4x64_epi64(res_8b, 216);
          __m128i res = _mm256_castsi256_si128(res_8b);
          _mm_storeu_si128((__m128i *)&dst[i * dst_stride + j], res);
        }
      }
    }
  } else if (horiz_tap == 12) {  // horiz_tap == 12
    const int fo_horiz = filter_params_x->taps / 2 - 1;
    const uint8_t *const src_ptr = src - fo_horiz;
    const __m256i v_zero = _mm256_setzero_si256();
    round_0_const = _mm256_set1_epi32((1 << (conv_params->round_0)) >> 1);
    round_const = _mm256_set1_epi32((1 << bits) >> 1);
    round_0_shift = _mm_cvtsi32_si128(conv_params->round_0);
    __m256i s[6];

    if (w <= 4) {
      for (i = 0; i < h; i += 2) {
        const __m256i data = _mm256_permute2x128_si256(
            _mm256_castsi128_si256(
                _mm_loadu_si128((__m128i *)(&src_ptr[i * src_stride]))),
            _mm256_castsi128_si256(_mm_loadu_si128(
                (__m128i *)(&src_ptr[i * src_stride + src_stride]))),
            0x20);
        // row0 0..7 row1 0..7
        const __m256i s_16lo = _mm256_unpacklo_epi8(data, v_zero);
        // row0 8..F row1 8..F
        const __m256i s_16hi = _mm256_unpackhi_epi8(data, v_zero);

        // row0 00 00 01 01 .. 03 03 row1 00 00 01 01 .. 03 03
        const __m256i s_lolo = _mm256_unpacklo_epi16(s_16lo, s_16lo);
        // row0 04 04 .. 07 07 row1 04 04 .. 07 07
        const __m256i s_lohi = _mm256_unpackhi_epi16(s_16lo, s_16lo);

        // row0 08 08 09 09 .. 0B 0B row1 08 08 09 09 .. 0B 0B
        const __m256i s_hilo = _mm256_unpacklo_epi16(s_16hi, s_16hi);
        // row0 0C 0C .. 0F 0F row1 0C 0C .. 0F 0F
        const __m256i s_hihi = _mm256_unpackhi_epi16(s_16hi, s_16hi);

        // 00 01 01 02 02 03 03 04 10 11 11 12 12 13 13 14
        s[0] = _mm256_alignr_epi8(s_lohi, s_lolo, 2);
        // 02 03 03 04 04 05 05 06 12 13 13 14 14 15 15 16
        s[1] = _mm256_alignr_epi8(s_lohi, s_lolo, 10);
        // 04 05 05 06 06 07 07 08 14 15 15 16 16 17 17 18
        s[2] = _mm256_alignr_epi8(s_hilo, s_lohi, 2);
        // 06 07 07 08 08 09 09 0A 16 17 17 18 18 19 19 1A
        s[3] = _mm256_alignr_epi8(s_hilo, s_lohi, 10);
        // 08 09 09 0A 0A 0B 0B 0C 18 19 19 1A 1A 1B 1B 1C
        s[4] = _mm256_alignr_epi8(s_hihi, s_hilo, 2);
        // 0A 0B 0B 0C 0C 0D 0D 0E 1A 1B 1B 1C 1C 1D 1D 1E
        s[5] = _mm256_alignr_epi8(s_hihi, s_hilo, 10);

        const __m256i res_lo = convolve_12taps(s, coeffs);

        __m256i res_32b_lo = _mm256_sra_epi32(
            _mm256_add_epi32(res_lo, round_0_const), round_0_shift);

        // 00 01 02 03 10 12 13 14
        res_32b_lo = _mm256_sra_epi32(_mm256_add_epi32(res_32b_lo, round_const),
                                      round_shift);
        // 8 bit conversion and saturation to uint8
        // 00 01 02 03 00 01 02 03 10 11 12 13 10 11 12 13
        __m256i res_16b_lo = _mm256_packs_epi32(res_32b_lo, res_32b_lo);
        // 00 01 02 03 00 01 02 03 00 01 02 03 00 01 02 03
        // 10 11 12 13 10 11 12 13 10 11 12 13 10 11 12 13
        __m256i res_8b_lo = _mm256_packus_epi16(res_16b_lo, res_16b_lo);

        // 00 01 02 03 00 01 02 03 00 01 02 03 00 01 02 03
        const __m128i res_0 = _mm256_extracti128_si256(res_8b_lo, 0);
        // 10 11 12 13 10 11 12 13 10 11 12 13 10 11 12 13
        const __m128i res_1 = _mm256_extracti128_si256(res_8b_lo, 1);
        if (w > 2) {
          // 00 01 02 03
          *(int *)&dst[i * dst_stride] = _mm_cvtsi128_si32(res_0);
          // 10 11 12 13
          *(int *)&dst[i * dst_stride + dst_stride] = _mm_cvtsi128_si32(res_1);
        } else {
          // 00 01
          *(uint16_t *)&dst[i * dst_stride] =
              (uint16_t)_mm_cvtsi128_si32(res_0);
          // 10 11
          *(uint16_t *)&dst[i * dst_stride + dst_stride] =
              (uint16_t)_mm_cvtsi128_si32(res_1);
        }
      }
    } else {
      for (i = 0; i < h; i++) {
        for (int j = 0; j < w; j += 8) {
          const __m256i data = _mm256_permute2x128_si256(
              _mm256_castsi128_si256(
                  _mm_loadu_si128((__m128i *)(&src_ptr[i * src_stride + j]))),
              _mm256_castsi128_si256(_mm_loadu_si128(
                  (__m128i *)(&src_ptr[i * src_stride + j + 4]))),
              0x20);
          // row0 0..7 4..B
          const __m256i s_16lo = _mm256_unpacklo_epi8(data, v_zero);
          // row0 8..F C..13
          const __m256i s_16hi = _mm256_unpackhi_epi8(data, v_zero);

          // row0 00 00 01 01 .. 03 03 04 04 05 05 .. 07 07
          const __m256i s_lolo = _mm256_unpacklo_epi16(s_16lo, s_16lo);
          // row0 04 04 .. 07 07 08 08 .. 0B 0B
          const __m256i s_lohi = _mm256_unpackhi_epi16(s_16lo, s_16lo);

          // row0 08 08 09 09 .. 0B 0B 0C 0C 0D 0D .. 0F 0F
          const __m256i s_hilo = _mm256_unpacklo_epi16(s_16hi, s_16hi);
          // row0 0C 0C 0D 0D .. 0F 0F 10 10 11 11 .. 13 13
          const __m256i s_hihi = _mm256_unpackhi_epi16(s_16hi, s_16hi);

          s[0] = _mm256_alignr_epi8(s_lohi, s_lolo, 2);
          s[1] = _mm256_alignr_epi8(s_lohi, s_lolo, 10);
          s[2] = _mm256_alignr_epi8(s_hilo, s_lohi, 2);
          s[3] = _mm256_alignr_epi8(s_hilo, s_lohi, 10);
          s[4] = _mm256_alignr_epi8(s_hihi, s_hilo, 2);
          s[5] = _mm256_alignr_epi8(s_hihi, s_hilo, 10);

          const __m256i res_lo = convolve_12taps(s, coeffs);

          __m256i res_32b_lo = _mm256_sra_epi32(
              _mm256_add_epi32(res_lo, round_0_const), round_0_shift);

          res_32b_lo = _mm256_sra_epi32(
              _mm256_add_epi32(res_32b_lo, round_const), round_shift);
          // 8 bit conversion and saturation to uint8
          __m256i res_16b_lo = _mm256_packs_epi32(res_32b_lo, res_32b_lo);
          __m256i res_8b_lo = _mm256_packus_epi16(res_16b_lo, res_16b_lo);
          const __m128i res_0 = _mm256_extracti128_si256(res_8b_lo, 0);
          const __m128i res_1 = _mm256_extracti128_si256(res_8b_lo, 1);
          *(int *)&dst[i * dst_stride + j] = _mm_cvtsi128_si32(res_0);
          *(int *)&dst[i * dst_stride + j + 4] = _mm_cvtsi128_si32(res_1);
        }
      }
    }
  } else {
    const int fo_horiz = filter_params_x->taps / 2 - 1;
    const uint8_t *const src_ptr = src - fo_horiz;
    filt[2] = _mm256_load_si256((__m256i const *)(filt_global_avx2 + 32 * 2));
    filt[3] = _mm256_load_si256((__m256i const *)(filt_global_avx2 + 32 * 3));

    if (w <= 8) {
      for (i = 0; i < h; i += 2) {
        const __m256i data = _mm256_permute2x128_si256(
            _mm256_castsi128_si256(
                _mm_loadu_si128((__m128i *)(&src_ptr[i * src_stride]))),
            _mm256_castsi128_si256(_mm_loadu_si128(
                (__m128i *)(&src_ptr[i * src_stride + src_stride]))),
            0x20);

        __m256i res_16b = convolve_lowbd_x(data, coeffs, filt);

        res_16b = _mm256_sra_epi16(_mm256_add_epi16(res_16b, round_0_const),
                                   round_0_shift);

        res_16b = _mm256_sra_epi16(_mm256_add_epi16(res_16b, round_const),
                                   round_shift);

        /* rounding code */
        // 8 bit conversion and saturation to uint8
        __m256i res_8b = _mm256_packus_epi16(res_16b, res_16b);

        const __m128i res_0 = _mm256_castsi256_si128(res_8b);
        const __m128i res_1 = _mm256_extracti128_si256(res_8b, 1);
        if (w > 4) {
          _mm_storel_epi64((__m128i *)&dst[i * dst_stride], res_0);
          _mm_storel_epi64((__m128i *)&dst[i * dst_stride + dst_stride], res_1);
        } else if (w > 2) {
          xx_storel_32(&dst[i * dst_stride], res_0);
          xx_storel_32(&dst[i * dst_stride + dst_stride], res_1);
        } else {
          __m128i *const p_0 = (__m128i *)&dst[i * dst_stride];
          __m128i *const p_1 = (__m128i *)&dst[i * dst_stride + dst_stride];
          *(uint16_t *)p_0 = (uint16_t)_mm_cvtsi128_si32(res_0);
          *(uint16_t *)p_1 = (uint16_t)_mm_cvtsi128_si32(res_1);
        }
      }
    } else {
      for (i = 0; i < h; ++i) {
        for (int j = 0; j < w; j += 16) {
          // 0 1 2 3 4 5 6 7 8 9 10 11 12 13 14 15 8 9 10 11 12 13 14 15 16 17
          // 18 19 20 21 22 23
          const __m256i data = _mm256_inserti128_si256(
              _mm256_loadu_si256((__m256i *)&src_ptr[(i * src_stride) + j]),
              _mm_loadu_si128((__m128i *)&src_ptr[(i * src_stride) + (j + 8)]),
              1);

          __m256i res_16b = convolve_lowbd_x(data, coeffs, filt);

          res_16b = _mm256_sra_epi16(_mm256_add_epi16(res_16b, round_0_const),
                                     round_0_shift);

          res_16b = _mm256_sra_epi16(_mm256_add_epi16(res_16b, round_const),
                                     round_shift);

          /* rounding code */
          // 8 bit conversion and saturation to uint8
          __m256i res_8b = _mm256_packus_epi16(res_16b, res_16b);

          // Store values into the destination buffer
          // 0 1 2 3 4 5 6 7 8 9 10 11 12 13 14 15
          res_8b = _mm256_permute4x64_epi64(res_8b, 216);
          __m128i res = _mm256_castsi256_si128(res_8b);
          _mm_storeu_si128((__m128i *)&dst[i * dst_stride + j], res);
        }
      }
    }
  }
}